

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiMBIntersectorK<4,4>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  __int_type_conflict _Var4;
  long lVar5;
  long lVar6;
  RTCFilterFunctionN p_Var7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  ulong uVar17;
  undefined8 uVar18;
  int iVar19;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [12];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  byte bVar56;
  byte bVar57;
  byte bVar58;
  byte bVar59;
  uint uVar60;
  byte bVar61;
  bool bVar62;
  long lVar63;
  undefined1 uVar64;
  bool bVar65;
  undefined1 uVar66;
  ulong uVar67;
  ulong uVar68;
  uint uVar69;
  uint uVar70;
  uint uVar121;
  uint uVar122;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  uint uVar124;
  uint uVar125;
  uint uVar126;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  uint uVar123;
  uint uVar127;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  float fVar128;
  vint4 bi_2;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar146;
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  float fVar147;
  float fVar148;
  undefined4 uVar149;
  float fVar166;
  float fVar168;
  vint4 bi_1;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar167;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar162 [32];
  undefined1 auVar153 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  vint4 bi;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  vint4 ai_2;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar219 [32];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [64];
  undefined1 auVar222 [64];
  vint4 ai_1;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  vint4 ai;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [64];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [32];
  undefined1 auVar245 [16];
  undefined1 auVar246 [64];
  undefined4 uVar248;
  undefined4 uVar249;
  undefined1 auVar247 [28];
  undefined1 auVar250 [32];
  undefined1 auVar251 [64];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [16];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  undefined1 local_9a0 [16];
  uint local_990;
  int local_98c;
  float local_988;
  float local_984;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  ulong local_738;
  RTCFilterFunctionNArguments local_730;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [16];
  undefined1 local_690 [16];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  Primitive *local_5f0;
  ulong local_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  RTCHitN local_460 [16];
  undefined1 auStack_450 [16];
  undefined4 local_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  float local_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [16];
  undefined8 local_410;
  undefined8 uStack_408;
  undefined1 local_400 [16];
  uint local_3f0;
  uint uStack_3ec;
  uint uStack_3e8;
  uint uStack_3e4;
  uint uStack_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [32];
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  byte abStack_180 [32];
  uint auStack_160 [7];
  float fStack_144;
  ulong uStack_140;
  int aiStack_138 [66];
  
  PVar2 = prim[1];
  uVar68 = (ulong)(byte)PVar2;
  lVar20 = uVar68 * 0x25;
  fVar128 = *(float *)(prim + lVar20 + 0x12);
  auVar75 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar74 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar74 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar75 = vsubps_avx(auVar75,*(undefined1 (*) [16])(prim + lVar20 + 6));
  auVar204._0_4_ = fVar128 * auVar75._0_4_;
  auVar204._4_4_ = fVar128 * auVar75._4_4_;
  auVar204._8_4_ = fVar128 * auVar75._8_4_;
  auVar204._12_4_ = fVar128 * auVar75._12_4_;
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 4 + 6)));
  auVar129._0_4_ = fVar128 * auVar74._0_4_;
  auVar129._4_4_ = fVar128 * auVar74._4_4_;
  auVar129._8_4_ = fVar128 * auVar74._8_4_;
  auVar129._12_4_ = fVar128 * auVar74._12_4_;
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 5 + 6)));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 6 + 6)));
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0xf + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar2 * 0x10 + 6)));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar68 + 6)));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1a + 6)));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1b + 6)));
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar264 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1c + 6)));
  auVar264 = vcvtdq2ps_avx(auVar264);
  auVar223._4_4_ = auVar129._0_4_;
  auVar223._0_4_ = auVar129._0_4_;
  auVar223._8_4_ = auVar129._0_4_;
  auVar223._12_4_ = auVar129._0_4_;
  auVar82 = vshufps_avx(auVar129,auVar129,0x55);
  auVar83 = vshufps_avx(auVar129,auVar129,0xaa);
  fVar128 = auVar83._0_4_;
  auVar178._0_4_ = fVar128 * auVar77._0_4_;
  fVar147 = auVar83._4_4_;
  auVar178._4_4_ = fVar147 * auVar77._4_4_;
  fVar166 = auVar83._8_4_;
  auVar178._8_4_ = fVar166 * auVar77._8_4_;
  fVar168 = auVar83._12_4_;
  auVar178._12_4_ = fVar168 * auVar77._12_4_;
  auVar150._0_4_ = auVar79._0_4_ * fVar128;
  auVar150._4_4_ = auVar79._4_4_ * fVar147;
  auVar150._8_4_ = auVar79._8_4_ * fVar166;
  auVar150._12_4_ = auVar79._12_4_ * fVar168;
  auVar130._0_4_ = auVar264._0_4_ * fVar128;
  auVar130._4_4_ = auVar264._4_4_ * fVar147;
  auVar130._8_4_ = auVar264._8_4_ * fVar166;
  auVar130._12_4_ = auVar264._12_4_ * fVar168;
  auVar83 = vfmadd231ps_fma(auVar178,auVar82,auVar74);
  auVar22 = vfmadd231ps_fma(auVar150,auVar82,auVar80);
  auVar82 = vfmadd231ps_fma(auVar130,auVar76,auVar82);
  auVar23 = vfmadd231ps_fma(auVar83,auVar223,auVar75);
  auVar22 = vfmadd231ps_fma(auVar22,auVar223,auVar78);
  auVar24 = vfmadd231ps_fma(auVar82,auVar81,auVar223);
  auVar253._4_4_ = auVar204._0_4_;
  auVar253._0_4_ = auVar204._0_4_;
  auVar253._8_4_ = auVar204._0_4_;
  auVar253._12_4_ = auVar204._0_4_;
  auVar82 = vshufps_avx(auVar204,auVar204,0x55);
  auVar83 = vshufps_avx(auVar204,auVar204,0xaa);
  fVar128 = auVar83._0_4_;
  auVar224._0_4_ = fVar128 * auVar77._0_4_;
  fVar147 = auVar83._4_4_;
  auVar224._4_4_ = fVar147 * auVar77._4_4_;
  fVar166 = auVar83._8_4_;
  auVar224._8_4_ = fVar166 * auVar77._8_4_;
  fVar168 = auVar83._12_4_;
  auVar224._12_4_ = fVar168 * auVar77._12_4_;
  auVar210._0_4_ = auVar79._0_4_ * fVar128;
  auVar210._4_4_ = auVar79._4_4_ * fVar147;
  auVar210._8_4_ = auVar79._8_4_ * fVar166;
  auVar210._12_4_ = auVar79._12_4_ * fVar168;
  auVar205._0_4_ = auVar264._0_4_ * fVar128;
  auVar205._4_4_ = auVar264._4_4_ * fVar147;
  auVar205._8_4_ = auVar264._8_4_ * fVar166;
  auVar205._12_4_ = auVar264._12_4_ * fVar168;
  auVar74 = vfmadd231ps_fma(auVar224,auVar82,auVar74);
  auVar77 = vfmadd231ps_fma(auVar210,auVar82,auVar80);
  auVar80 = vfmadd231ps_fma(auVar205,auVar82,auVar76);
  auVar25 = vfmadd231ps_fma(auVar74,auVar253,auVar75);
  auVar129 = vfmadd231ps_fma(auVar77,auVar253,auVar78);
  auVar245._8_4_ = 0x7fffffff;
  auVar245._0_8_ = 0x7fffffff7fffffff;
  auVar245._12_4_ = 0x7fffffff;
  auVar130 = vfmadd231ps_fma(auVar80,auVar253,auVar81);
  auVar75 = vandps_avx(auVar245,auVar23);
  auVar242._8_4_ = 0x219392ef;
  auVar242._0_8_ = 0x219392ef219392ef;
  auVar242._12_4_ = 0x219392ef;
  uVar67 = vcmpps_avx512vl(auVar75,auVar242,1);
  bVar62 = (bool)((byte)uVar67 & 1);
  auVar71._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar23._0_4_;
  bVar62 = (bool)((byte)(uVar67 >> 1) & 1);
  auVar71._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar23._4_4_;
  bVar62 = (bool)((byte)(uVar67 >> 2) & 1);
  auVar71._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar23._8_4_;
  bVar62 = (bool)((byte)(uVar67 >> 3) & 1);
  auVar71._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar23._12_4_;
  auVar75 = vandps_avx(auVar245,auVar22);
  uVar67 = vcmpps_avx512vl(auVar75,auVar242,1);
  bVar62 = (bool)((byte)uVar67 & 1);
  auVar72._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar22._0_4_;
  bVar62 = (bool)((byte)(uVar67 >> 1) & 1);
  auVar72._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar22._4_4_;
  bVar62 = (bool)((byte)(uVar67 >> 2) & 1);
  auVar72._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar22._8_4_;
  bVar62 = (bool)((byte)(uVar67 >> 3) & 1);
  auVar72._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar22._12_4_;
  auVar75 = vandps_avx(auVar245,auVar24);
  uVar67 = vcmpps_avx512vl(auVar75,auVar242,1);
  bVar62 = (bool)((byte)uVar67 & 1);
  auVar73._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar24._0_4_;
  bVar62 = (bool)((byte)(uVar67 >> 1) & 1);
  auVar73._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar24._4_4_;
  bVar62 = (bool)((byte)(uVar67 >> 2) & 1);
  auVar73._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar24._8_4_;
  bVar62 = (bool)((byte)(uVar67 >> 3) & 1);
  auVar73._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar24._12_4_;
  auVar74 = vrcp14ps_avx512vl(auVar71);
  auVar243._8_4_ = 0x3f800000;
  auVar243._0_8_ = 0x3f8000003f800000;
  auVar243._12_4_ = 0x3f800000;
  auVar75 = vfnmadd213ps_fma(auVar71,auVar74,auVar243);
  auVar23 = vfmadd132ps_fma(auVar75,auVar74,auVar74);
  auVar74 = vrcp14ps_avx512vl(auVar72);
  auVar75 = vfnmadd213ps_fma(auVar72,auVar74,auVar243);
  auVar24 = vfmadd132ps_fma(auVar75,auVar74,auVar74);
  auVar74 = vrcp14ps_avx512vl(auVar73);
  auVar75 = vfnmadd213ps_fma(auVar73,auVar74,auVar243);
  auVar21 = vfmadd132ps_fma(auVar75,auVar74,auVar74);
  fVar128 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar20 + 0x16)) *
            *(float *)(prim + lVar20 + 0x1a);
  auVar232._4_4_ = fVar128;
  auVar232._0_4_ = fVar128;
  auVar232._8_4_ = fVar128;
  auVar232._12_4_ = fVar128;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar68 * 7 + 6);
  auVar75 = vpmovsxwd_avx(auVar75);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar68 * 0xb + 6);
  auVar74 = vpmovsxwd_avx(auVar74);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar78 = vsubps_avx(auVar74,auVar75);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar68 * 9 + 6);
  auVar74 = vpmovsxwd_avx(auVar77);
  auVar77 = vfmadd213ps_fma(auVar78,auVar232,auVar75);
  auVar75 = vcvtdq2ps_avx(auVar74);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar68 * 0xd + 6);
  auVar74 = vpmovsxwd_avx(auVar78);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,auVar75);
  auVar78 = vfmadd213ps_fma(auVar74,auVar232,auVar75);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar68 * 0x12 + 6);
  auVar75 = vpmovsxwd_avx(auVar80);
  auVar75 = vcvtdq2ps_avx(auVar75);
  uVar67 = (ulong)(uint)((int)(uVar68 * 5) << 2);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar68 * 2 + uVar67 + 6);
  auVar74 = vpmovsxwd_avx(auVar79);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,auVar75);
  auVar80 = vfmadd213ps_fma(auVar74,auVar232,auVar75);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar67 + 6);
  auVar75 = vpmovsxwd_avx(auVar81);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar68 * 0x18 + 6);
  auVar74 = vpmovsxwd_avx(auVar76);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,auVar75);
  auVar79 = vfmadd213ps_fma(auVar74,auVar232,auVar75);
  auVar264._8_8_ = 0;
  auVar264._0_8_ = *(ulong *)(prim + uVar68 * 0x1d + 6);
  auVar75 = vpmovsxwd_avx(auVar264);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar68 + (ulong)(byte)PVar2 * 0x20 + 6);
  auVar74 = vpmovsxwd_avx(auVar82);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,auVar75);
  auVar81 = vfmadd213ps_fma(auVar74,auVar232,auVar75);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar2 * 0x20 - uVar68) + 6);
  auVar75 = vpmovsxwd_avx(auVar83);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar68 * 0x23 + 6);
  auVar74 = vpmovsxwd_avx(auVar22);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,auVar75);
  auVar74 = vfmadd213ps_fma(auVar74,auVar232,auVar75);
  auVar75 = vsubps_avx(auVar77,auVar25);
  auVar233._0_4_ = auVar23._0_4_ * auVar75._0_4_;
  auVar233._4_4_ = auVar23._4_4_ * auVar75._4_4_;
  auVar233._8_4_ = auVar23._8_4_ * auVar75._8_4_;
  auVar233._12_4_ = auVar23._12_4_ * auVar75._12_4_;
  auVar75 = vsubps_avx(auVar78,auVar25);
  auVar179._0_4_ = auVar23._0_4_ * auVar75._0_4_;
  auVar179._4_4_ = auVar23._4_4_ * auVar75._4_4_;
  auVar179._8_4_ = auVar23._8_4_ * auVar75._8_4_;
  auVar179._12_4_ = auVar23._12_4_ * auVar75._12_4_;
  auVar75 = vsubps_avx(auVar80,auVar129);
  auVar225._0_4_ = auVar24._0_4_ * auVar75._0_4_;
  auVar225._4_4_ = auVar24._4_4_ * auVar75._4_4_;
  auVar225._8_4_ = auVar24._8_4_ * auVar75._8_4_;
  auVar225._12_4_ = auVar24._12_4_ * auVar75._12_4_;
  auVar75 = vsubps_avx(auVar79,auVar129);
  auVar151._0_4_ = auVar24._0_4_ * auVar75._0_4_;
  auVar151._4_4_ = auVar24._4_4_ * auVar75._4_4_;
  auVar151._8_4_ = auVar24._8_4_ * auVar75._8_4_;
  auVar151._12_4_ = auVar24._12_4_ * auVar75._12_4_;
  auVar75 = vsubps_avx(auVar81,auVar130);
  auVar211._0_4_ = auVar21._0_4_ * auVar75._0_4_;
  auVar211._4_4_ = auVar21._4_4_ * auVar75._4_4_;
  auVar211._8_4_ = auVar21._8_4_ * auVar75._8_4_;
  auVar211._12_4_ = auVar21._12_4_ * auVar75._12_4_;
  auVar75 = vsubps_avx(auVar74,auVar130);
  auVar131._0_4_ = auVar21._0_4_ * auVar75._0_4_;
  auVar131._4_4_ = auVar21._4_4_ * auVar75._4_4_;
  auVar131._8_4_ = auVar21._8_4_ * auVar75._8_4_;
  auVar131._12_4_ = auVar21._12_4_ * auVar75._12_4_;
  auVar75 = vpminsd_avx(auVar233,auVar179);
  auVar74 = vpminsd_avx(auVar225,auVar151);
  auVar75 = vmaxps_avx(auVar75,auVar74);
  auVar74 = vpminsd_avx(auVar211,auVar131);
  uVar149 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar23._4_4_ = uVar149;
  auVar23._0_4_ = uVar149;
  auVar23._8_4_ = uVar149;
  auVar23._12_4_ = uVar149;
  auVar74 = vmaxps_avx512vl(auVar74,auVar23);
  auVar75 = vmaxps_avx(auVar75,auVar74);
  auVar24._8_4_ = 0x3f7ffffa;
  auVar24._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar24._12_4_ = 0x3f7ffffa;
  local_320 = vmulps_avx512vl(auVar75,auVar24);
  auVar75 = vpmaxsd_avx(auVar233,auVar179);
  auVar74 = vpmaxsd_avx(auVar225,auVar151);
  auVar75 = vminps_avx(auVar75,auVar74);
  auVar74 = vpmaxsd_avx(auVar211,auVar131);
  uVar149 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar21._4_4_ = uVar149;
  auVar21._0_4_ = uVar149;
  auVar21._8_4_ = uVar149;
  auVar21._12_4_ = uVar149;
  auVar74 = vminps_avx512vl(auVar74,auVar21);
  auVar75 = vminps_avx(auVar75,auVar74);
  auVar25._8_4_ = 0x3f800003;
  auVar25._0_8_ = 0x3f8000033f800003;
  auVar25._12_4_ = 0x3f800003;
  auVar75 = vmulps_avx512vl(auVar75,auVar25);
  auVar74 = vpbroadcastd_avx512vl();
  uVar15 = vcmpps_avx512vl(local_320,auVar75,2);
  local_5e8 = vpcmpgtd_avx512vl(auVar74,_DAT_01f7fcf0);
  local_5e8 = ((byte)uVar15 & 0xf) & local_5e8;
  if ((char)local_5e8 == '\0') {
    return false;
  }
  local_490 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_5f0 = prim;
LAB_01b69382:
  lVar20 = 0;
  for (uVar67 = local_5e8; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
    lVar20 = lVar20 + 1;
  }
  local_738 = (ulong)*(uint *)(local_5f0 + 2);
  pGVar3 = (context->scene->geometries).items[local_738].ptr;
  uVar67 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           (ulong)*(uint *)(local_5f0 + lVar20 * 4 + 6) *
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar128 = (pGVar3->time_range).lower;
  fVar128 = pGVar3->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar128) / ((pGVar3->time_range).upper - fVar128));
  auVar75 = vroundss_avx(ZEXT416((uint)fVar128),ZEXT416((uint)fVar128),9);
  auVar75 = vminss_avx(auVar75,ZEXT416((uint)(pGVar3->fnumTimeSegments + -1.0)));
  auVar75 = vmaxss_avx(ZEXT816(0) << 0x20,auVar75);
  fVar128 = fVar128 - auVar75._0_4_;
  _Var4 = pGVar3[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar63 = (long)(int)auVar75._0_4_ * 0x38;
  lVar20 = *(long *)(_Var4 + 0x10 + lVar63);
  lVar5 = *(long *)(_Var4 + 0x38 + lVar63);
  lVar6 = *(long *)(_Var4 + 0x48 + lVar63);
  pfVar1 = (float *)(lVar5 + uVar67 * lVar6);
  auVar132._0_4_ = fVar128 * *pfVar1;
  auVar132._4_4_ = fVar128 * pfVar1[1];
  auVar132._8_4_ = fVar128 * pfVar1[2];
  auVar132._12_4_ = fVar128 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + (uVar67 + 1) * lVar6);
  auVar152._0_4_ = fVar128 * *pfVar1;
  auVar152._4_4_ = fVar128 * pfVar1[1];
  auVar152._8_4_ = fVar128 * pfVar1[2];
  auVar152._12_4_ = fVar128 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + (uVar67 + 2) * lVar6);
  auVar180._0_4_ = fVar128 * *pfVar1;
  auVar180._4_4_ = fVar128 * pfVar1[1];
  auVar180._8_4_ = fVar128 * pfVar1[2];
  auVar180._12_4_ = fVar128 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + lVar6 * (uVar67 + 3));
  auVar206._0_4_ = fVar128 * *pfVar1;
  auVar206._4_4_ = fVar128 * pfVar1[1];
  auVar206._8_4_ = fVar128 * pfVar1[2];
  auVar206._12_4_ = fVar128 * pfVar1[3];
  lVar5 = *(long *)(_Var4 + lVar63);
  fVar128 = 1.0 - fVar128;
  auVar212._4_4_ = fVar128;
  auVar212._0_4_ = fVar128;
  auVar212._8_4_ = fVar128;
  auVar212._12_4_ = fVar128;
  auVar77 = vfmadd231ps_fma(auVar132,auVar212,*(undefined1 (*) [16])(lVar5 + lVar20 * uVar67));
  auVar78 = vfmadd231ps_fma(auVar152,auVar212,*(undefined1 (*) [16])(lVar5 + lVar20 * (uVar67 + 1)))
  ;
  auVar80 = vfmadd231ps_fma(auVar180,auVar212,*(undefined1 (*) [16])(lVar5 + lVar20 * (uVar67 + 2)))
  ;
  auVar79 = vfmadd231ps_fma(auVar206,auVar212,*(undefined1 (*) [16])(lVar5 + lVar20 * (uVar67 + 3)))
  ;
  auVar75 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar74 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  _local_380 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x40)));
  local_3a0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
  auVar75 = vunpcklps_avx512vl(local_380._0_16_,local_3a0._0_16_);
  local_3c0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
  auVar264 = local_3c0._0_16_;
  local_690 = vinsertps_avx512f(auVar75,auVar264,0x28);
  auVar226._0_4_ = auVar77._0_4_ + auVar78._0_4_ + auVar80._0_4_ + auVar79._0_4_;
  auVar226._4_4_ = auVar77._4_4_ + auVar78._4_4_ + auVar80._4_4_ + auVar79._4_4_;
  auVar226._8_4_ = auVar77._8_4_ + auVar78._8_4_ + auVar80._8_4_ + auVar79._8_4_;
  auVar226._12_4_ = auVar77._12_4_ + auVar78._12_4_ + auVar80._12_4_ + auVar79._12_4_;
  auVar26._8_4_ = 0x3e800000;
  auVar26._0_8_ = 0x3e8000003e800000;
  auVar26._12_4_ = 0x3e800000;
  auVar75 = vmulps_avx512vl(auVar226,auVar26);
  auVar75 = vsubps_avx(auVar75,auVar74);
  auVar75 = vdpps_avx(auVar75,local_690,0x7f);
  fVar128 = *(float *)(ray + k * 4 + 0x30);
  local_6a0 = vdpps_avx(local_690,local_690,0x7f);
  local_470 = vpbroadcastd_avx512vl();
  auVar234._4_12_ = ZEXT812(0) << 0x20;
  auVar234._0_4_ = local_6a0._0_4_;
  auVar76 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar234);
  auVar81 = vfnmadd213ss_fma(auVar76,local_6a0,ZEXT416(0x40000000));
  local_260 = auVar75._0_4_ * auVar76._0_4_ * auVar81._0_4_;
  auVar235._4_4_ = local_260;
  auVar235._0_4_ = local_260;
  auVar235._8_4_ = local_260;
  auVar235._12_4_ = local_260;
  fStack_970 = local_260;
  _local_980 = auVar235;
  fStack_96c = local_260;
  fStack_968 = local_260;
  fStack_964 = local_260;
  auVar75 = vfmadd231ps_fma(auVar74,local_690,auVar235);
  auVar75 = vblendps_avx(auVar75,ZEXT816(0) << 0x40,8);
  auVar74 = vsubps_avx(auVar77,auVar75);
  auVar77 = vsubps_avx(auVar80,auVar75);
  auVar78 = vsubps_avx(auVar78,auVar75);
  auVar75 = vsubps_avx(auVar79,auVar75);
  auVar84 = vbroadcastss_avx512vl(auVar74);
  auVar266 = ZEXT3264(auVar84);
  auVar86._8_4_ = 1;
  auVar86._0_8_ = 0x100000001;
  auVar86._12_4_ = 1;
  auVar86._16_4_ = 1;
  auVar86._20_4_ = 1;
  auVar86._24_4_ = 1;
  auVar86._28_4_ = 1;
  local_560 = ZEXT1632(auVar74);
  local_820 = vpermps_avx2(auVar86,local_560);
  auVar246 = ZEXT3264(local_820);
  auVar87._8_4_ = 2;
  auVar87._0_8_ = 0x200000002;
  auVar87._12_4_ = 2;
  auVar87._16_4_ = 2;
  auVar87._20_4_ = 2;
  auVar87._24_4_ = 2;
  auVar87._28_4_ = 2;
  local_840 = vpermps_avx2(auVar87,local_560);
  auVar251 = ZEXT3264(local_840);
  auVar88._8_4_ = 3;
  auVar88._0_8_ = 0x300000003;
  auVar88._12_4_ = 3;
  auVar88._16_4_ = 3;
  auVar88._20_4_ = 3;
  auVar88._24_4_ = 3;
  auVar88._28_4_ = 3;
  local_880 = vpermps_avx512vl(auVar88,local_560);
  auVar265 = ZEXT3264(local_880);
  uVar149 = auVar78._0_4_;
  local_5e0._4_4_ = uVar149;
  local_5e0._0_4_ = uVar149;
  local_5e0._8_4_ = uVar149;
  local_5e0._12_4_ = uVar149;
  local_5e0._16_4_ = uVar149;
  local_5e0._20_4_ = uVar149;
  local_5e0._24_4_ = uVar149;
  local_5e0._28_4_ = uVar149;
  auVar221 = ZEXT3264(local_5e0);
  local_5a0 = ZEXT1632(auVar78);
  local_860 = vpermps_avx2(auVar86,local_5a0);
  auVar241 = ZEXT3264(local_860);
  local_8a0 = vpermps_avx2(auVar87,local_5a0);
  auVar254 = ZEXT3264(local_8a0);
  local_8c0 = vpermps_avx512vl(auVar88,local_5a0);
  auVar255 = ZEXT3264(local_8c0);
  local_8e0 = vbroadcastss_avx512vl(auVar77);
  auVar256 = ZEXT3264(local_8e0);
  local_580 = ZEXT1632(auVar77);
  local_900 = vpermps_avx512vl(auVar86,local_580);
  auVar257 = ZEXT3264(local_900);
  local_7a0 = vpermps_avx512vl(auVar87,local_580);
  auVar258 = ZEXT3264(local_7a0);
  local_920 = vpermps_avx512vl(auVar88,local_580);
  auVar259 = ZEXT3264(local_920);
  local_7c0 = vbroadcastss_avx512vl(auVar75);
  auVar260 = ZEXT3264(local_7c0);
  _local_5c0 = ZEXT1632(auVar75);
  local_940 = vpermps_avx512vl(auVar86,_local_5c0);
  auVar261 = ZEXT3264(local_940);
  local_960 = vpermps_avx512vl(auVar87,_local_5c0);
  auVar262 = ZEXT3264(local_960);
  local_7e0 = vpermps_avx512vl(auVar88,_local_5c0);
  auVar263 = ZEXT3264(local_7e0);
  auVar75 = vmulss_avx512f(auVar264,auVar264);
  auVar84 = vfmadd231ps_avx512vl(ZEXT1632(auVar75),local_3a0,local_3a0);
  local_240 = vfmadd231ps_avx512vl(auVar84,_local_380,_local_380);
  local_220._0_4_ = local_240._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  auVar84._8_4_ = 0x7fffffff;
  auVar84._0_8_ = 0x7fffffff7fffffff;
  auVar84._12_4_ = 0x7fffffff;
  auVar84._16_4_ = 0x7fffffff;
  auVar84._20_4_ = 0x7fffffff;
  auVar84._24_4_ = 0x7fffffff;
  auVar84._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_220,auVar84);
  local_640 = ZEXT416((uint)local_260);
  local_260 = fVar128 - local_260;
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  uVar60 = 0;
  bVar62 = false;
  local_98c = 1;
  local_480 = vpbroadcastd_avx512vl();
  auVar75 = vsqrtss_avx(local_6a0,local_6a0);
  local_984 = auVar75._0_4_;
  auVar75 = vsqrtss_avx(local_6a0,local_6a0);
  local_988 = auVar75._0_4_;
  local_310 = ZEXT816(0x3f80000000000000);
  do {
    auVar75 = vmovshdup_avx(local_310);
    auVar75 = vsubps_avx(auVar75,local_310);
    fVar147 = auVar75._0_4_;
    fVar146 = fVar147 * 0.04761905;
    auVar209._0_4_ = local_310._0_4_;
    auVar209._4_4_ = auVar209._0_4_;
    auVar209._8_4_ = auVar209._0_4_;
    auVar209._12_4_ = auVar209._0_4_;
    auVar209._16_4_ = auVar209._0_4_;
    auVar209._20_4_ = auVar209._0_4_;
    auVar209._24_4_ = auVar209._0_4_;
    auVar209._28_4_ = auVar209._0_4_;
    local_6c0._4_4_ = fVar147;
    local_6c0._0_4_ = fVar147;
    local_6c0._8_4_ = fVar147;
    local_6c0._12_4_ = fVar147;
    local_6c0._16_4_ = fVar147;
    local_6c0._20_4_ = fVar147;
    local_6c0._24_4_ = fVar147;
    local_6c0._28_4_ = fVar147;
    auVar75 = vfmadd231ps_fma(auVar209,local_6c0,_DAT_01faff20);
    auVar85 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar84 = vsubps_avx512vl(auVar85,ZEXT1632(auVar75));
    fVar147 = auVar75._0_4_;
    fVar166 = auVar75._4_4_;
    auVar101._4_4_ = auVar221._4_4_ * fVar166;
    auVar101._0_4_ = auVar221._0_4_ * fVar147;
    fVar168 = auVar75._8_4_;
    auVar101._8_4_ = auVar221._8_4_ * fVar168;
    fVar170 = auVar75._12_4_;
    auVar101._12_4_ = auVar221._12_4_ * fVar170;
    auVar101._16_4_ = auVar221._16_4_ * 0.0;
    auVar101._20_4_ = auVar221._20_4_ * 0.0;
    auVar101._24_4_ = auVar221._24_4_ * 0.0;
    auVar101._28_4_ = DAT_01faff20._28_4_;
    auVar89._4_4_ = auVar241._4_4_ * fVar166;
    auVar89._0_4_ = auVar241._0_4_ * fVar147;
    auVar89._8_4_ = auVar241._8_4_ * fVar168;
    auVar89._12_4_ = auVar241._12_4_ * fVar170;
    auVar89._16_4_ = auVar241._16_4_ * 0.0;
    auVar89._20_4_ = auVar241._20_4_ * 0.0;
    auVar89._24_4_ = auVar241._24_4_ * 0.0;
    auVar89._28_4_ = auVar209._0_4_;
    auVar222._0_4_ = auVar254._0_4_ * fVar147;
    auVar222._4_4_ = auVar254._4_4_ * fVar166;
    auVar222._8_4_ = auVar254._8_4_ * fVar168;
    auVar222._12_4_ = auVar254._12_4_ * fVar170;
    auVar222._16_4_ = auVar254._16_4_ * 0.0;
    auVar222._20_4_ = auVar254._20_4_ * 0.0;
    auVar222._28_36_ = auVar221._28_36_;
    auVar222._24_4_ = auVar254._24_4_ * 0.0;
    auVar86 = vmulps_avx512vl(auVar255._0_32_,ZEXT1632(auVar75));
    local_700 = auVar266._0_32_;
    auVar87 = vfmadd231ps_avx512vl(auVar101,auVar84,local_700);
    auVar74 = vfmadd231ps_fma(auVar89,auVar84,auVar246._0_32_);
    auVar77 = vfmadd231ps_fma(auVar222._0_32_,auVar84,auVar251._0_32_);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar84,auVar265._0_32_);
    auVar88 = vmulps_avx512vl(auVar256._0_32_,ZEXT1632(auVar75));
    auVar93 = ZEXT1632(auVar75);
    auVar89 = vmulps_avx512vl(auVar257._0_32_,auVar93);
    auVar90 = vmulps_avx512vl(auVar258._0_32_,auVar93);
    auVar91 = vmulps_avx512vl(auVar259._0_32_,auVar93);
    auVar78 = vfmadd231ps_fma(auVar88,auVar84,auVar221._0_32_);
    auVar80 = vfmadd231ps_fma(auVar89,auVar84,auVar241._0_32_);
    auVar79 = vfmadd231ps_fma(auVar90,auVar84,auVar254._0_32_);
    auVar88 = vfmadd231ps_avx512vl(auVar91,auVar84,auVar255._0_32_);
    auVar89 = vmulps_avx512vl(auVar260._0_32_,auVar93);
    auVar90 = vmulps_avx512vl(auVar261._0_32_,auVar93);
    auVar91 = vmulps_avx512vl(auVar262._0_32_,auVar93);
    auVar92 = vmulps_avx512vl(auVar263._0_32_,auVar93);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar84,auVar256._0_32_);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar84,auVar257._0_32_);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar84,auVar258._0_32_);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar84,auVar259._0_32_);
    auVar221._28_36_ = auVar254._28_36_;
    auVar221._0_28_ =
         ZEXT1628(CONCAT412(fVar170 * auVar78._12_4_,
                            CONCAT48(fVar168 * auVar78._8_4_,
                                     CONCAT44(fVar166 * auVar78._4_4_,fVar147 * auVar78._0_4_))));
    auVar93 = vmulps_avx512vl(auVar93,ZEXT1632(auVar80));
    auVar94 = vmulps_avx512vl(ZEXT1632(auVar75),ZEXT1632(auVar79));
    auVar95 = vmulps_avx512vl(ZEXT1632(auVar75),auVar88);
    auVar75 = vfmadd231ps_fma(auVar221._0_32_,auVar84,auVar87);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar84,ZEXT1632(auVar74));
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar84,ZEXT1632(auVar77));
    auVar96 = vfmadd231ps_avx512vl(auVar95,auVar84,auVar86);
    auVar95._4_4_ = auVar89._4_4_ * fVar166;
    auVar95._0_4_ = auVar89._0_4_ * fVar147;
    auVar95._8_4_ = auVar89._8_4_ * fVar168;
    auVar95._12_4_ = auVar89._12_4_ * fVar170;
    auVar95._16_4_ = auVar89._16_4_ * 0.0;
    auVar95._20_4_ = auVar89._20_4_ * 0.0;
    auVar95._24_4_ = auVar89._24_4_ * 0.0;
    auVar95._28_4_ = auVar86._28_4_;
    auVar97._4_4_ = auVar90._4_4_ * fVar166;
    auVar97._0_4_ = auVar90._0_4_ * fVar147;
    auVar97._8_4_ = auVar90._8_4_ * fVar168;
    auVar97._12_4_ = auVar90._12_4_ * fVar170;
    auVar97._16_4_ = auVar90._16_4_ * 0.0;
    auVar97._20_4_ = auVar90._20_4_ * 0.0;
    auVar97._24_4_ = auVar90._24_4_ * 0.0;
    auVar97._28_4_ = auVar89._28_4_;
    auVar98._4_4_ = auVar91._4_4_ * fVar166;
    auVar98._0_4_ = auVar91._0_4_ * fVar147;
    auVar98._8_4_ = auVar91._8_4_ * fVar168;
    auVar98._12_4_ = auVar91._12_4_ * fVar170;
    auVar98._16_4_ = auVar91._16_4_ * 0.0;
    auVar98._20_4_ = auVar91._20_4_ * 0.0;
    auVar98._24_4_ = auVar91._24_4_ * 0.0;
    auVar98._28_4_ = auVar90._28_4_;
    auVar99._4_4_ = auVar92._4_4_ * fVar166;
    auVar99._0_4_ = auVar92._0_4_ * fVar147;
    auVar99._8_4_ = auVar92._8_4_ * fVar168;
    auVar99._12_4_ = auVar92._12_4_ * fVar170;
    auVar99._16_4_ = auVar92._16_4_ * 0.0;
    auVar99._20_4_ = auVar92._20_4_ * 0.0;
    auVar99._24_4_ = auVar92._24_4_ * 0.0;
    auVar99._28_4_ = auVar91._28_4_;
    auVar74 = vfmadd231ps_fma(auVar95,auVar84,ZEXT1632(auVar78));
    auVar77 = vfmadd231ps_fma(auVar97,auVar84,ZEXT1632(auVar80));
    auVar78 = vfmadd231ps_fma(auVar98,auVar84,ZEXT1632(auVar79));
    auVar80 = vfmadd231ps_fma(auVar99,auVar84,auVar88);
    auVar100._28_4_ = auVar87._28_4_;
    auVar100._0_28_ =
         ZEXT1628(CONCAT412(auVar78._12_4_ * fVar170,
                            CONCAT48(auVar78._8_4_ * fVar168,
                                     CONCAT44(auVar78._4_4_ * fVar166,auVar78._0_4_ * fVar147))));
    auVar79 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar170 * auVar74._12_4_,
                                                 CONCAT48(fVar168 * auVar74._8_4_,
                                                          CONCAT44(fVar166 * auVar74._4_4_,
                                                                   fVar147 * auVar74._0_4_)))),
                              auVar84,ZEXT1632(auVar75));
    auVar95 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar77._12_4_ * fVar170,
                                            CONCAT48(auVar77._8_4_ * fVar168,
                                                     CONCAT44(auVar77._4_4_ * fVar166,
                                                              auVar77._0_4_ * fVar147)))),auVar84,
                         auVar93);
    auVar97 = vfmadd231ps_avx512vl(auVar100,auVar84,auVar94);
    auVar86 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar80._12_4_ * fVar170,
                                            CONCAT48(auVar80._8_4_ * fVar168,
                                                     CONCAT44(auVar80._4_4_ * fVar166,
                                                              auVar80._0_4_ * fVar147)))),auVar96,
                         auVar84);
    auVar84 = vsubps_avx(ZEXT1632(auVar74),ZEXT1632(auVar75));
    auVar87 = vsubps_avx512vl(ZEXT1632(auVar77),auVar93);
    auVar88 = vsubps_avx512vl(ZEXT1632(auVar78),auVar94);
    auVar89 = vsubps_avx512vl(ZEXT1632(auVar80),auVar96);
    auVar112._0_4_ = fVar146 * auVar84._0_4_ * 3.0;
    auVar112._4_4_ = fVar146 * auVar84._4_4_ * 3.0;
    auVar112._8_4_ = fVar146 * auVar84._8_4_ * 3.0;
    auVar112._12_4_ = fVar146 * auVar84._12_4_ * 3.0;
    auVar112._16_4_ = fVar146 * auVar84._16_4_ * 3.0;
    auVar112._20_4_ = fVar146 * auVar84._20_4_ * 3.0;
    auVar112._24_4_ = fVar146 * auVar84._24_4_ * 3.0;
    auVar112._28_4_ = 0;
    auVar140._0_4_ = fVar146 * auVar87._0_4_ * 3.0;
    auVar140._4_4_ = fVar146 * auVar87._4_4_ * 3.0;
    auVar140._8_4_ = fVar146 * auVar87._8_4_ * 3.0;
    auVar140._12_4_ = fVar146 * auVar87._12_4_ * 3.0;
    auVar140._16_4_ = fVar146 * auVar87._16_4_ * 3.0;
    auVar140._20_4_ = fVar146 * auVar87._20_4_ * 3.0;
    auVar140._24_4_ = fVar146 * auVar87._24_4_ * 3.0;
    auVar140._28_4_ = 0;
    auVar96._4_4_ = fVar146 * auVar88._4_4_ * 3.0;
    auVar96._0_4_ = fVar146 * auVar88._0_4_ * 3.0;
    auVar96._8_4_ = fVar146 * auVar88._8_4_ * 3.0;
    auVar96._12_4_ = fVar146 * auVar88._12_4_ * 3.0;
    auVar96._16_4_ = fVar146 * auVar88._16_4_ * 3.0;
    auVar96._20_4_ = fVar146 * auVar88._20_4_ * 3.0;
    auVar96._24_4_ = fVar146 * auVar88._24_4_ * 3.0;
    auVar96._28_4_ = auVar92._28_4_;
    fVar147 = auVar89._0_4_ * 3.0 * fVar146;
    fVar166 = auVar89._4_4_ * 3.0 * fVar146;
    auVar104._4_4_ = fVar166;
    auVar104._0_4_ = fVar147;
    fVar168 = auVar89._8_4_ * 3.0 * fVar146;
    auVar104._8_4_ = fVar168;
    fVar170 = auVar89._12_4_ * 3.0 * fVar146;
    auVar104._12_4_ = fVar170;
    fVar172 = auVar89._16_4_ * 3.0 * fVar146;
    auVar104._16_4_ = fVar172;
    fVar174 = auVar89._20_4_ * 3.0 * fVar146;
    auVar104._20_4_ = fVar174;
    fVar176 = auVar89._24_4_ * 3.0 * fVar146;
    auVar104._24_4_ = fVar176;
    auVar104._28_4_ = fVar146;
    auVar75 = vxorps_avx512vl(auVar263._0_16_,auVar263._0_16_);
    auVar98 = vpermt2ps_avx512vl(ZEXT1632(auVar79),_DAT_01feed00,ZEXT1632(auVar75));
    auVar99 = vpermt2ps_avx512vl(auVar95,_DAT_01feed00,ZEXT1632(auVar75));
    auVar87 = ZEXT1632(auVar75);
    auVar100 = vpermt2ps_avx512vl(auVar97,_DAT_01feed00,auVar87);
    auVar102._0_4_ = auVar86._0_4_ + fVar147;
    auVar102._4_4_ = auVar86._4_4_ + fVar166;
    auVar102._8_4_ = auVar86._8_4_ + fVar168;
    auVar102._12_4_ = auVar86._12_4_ + fVar170;
    auVar102._16_4_ = auVar86._16_4_ + fVar172;
    auVar102._20_4_ = auVar86._20_4_ + fVar174;
    auVar102._24_4_ = auVar86._24_4_ + fVar176;
    auVar102._28_4_ = auVar86._28_4_ + fVar146;
    auVar84 = vmaxps_avx(auVar86,auVar102);
    auVar90 = vminps_avx512vl(auVar86,auVar102);
    auVar91 = vpermt2ps_avx512vl(auVar86,_DAT_01feed00,auVar87);
    auVar101 = vpermt2ps_avx512vl(auVar112,_DAT_01feed00,auVar87);
    auVar102 = vpermt2ps_avx512vl(auVar140,_DAT_01feed00,auVar87);
    auVar109 = ZEXT1632(auVar75);
    auVar103 = vpermt2ps_avx512vl(auVar96,_DAT_01feed00,auVar109);
    auVar86 = vpermt2ps_avx512vl(auVar104,_DAT_01feed00,auVar109);
    auVar86 = vsubps_avx(auVar91,auVar86);
    auVar87 = vsubps_avx(auVar98,ZEXT1632(auVar79));
    auVar88 = vsubps_avx(auVar99,auVar95);
    auVar89 = vsubps_avx(auVar100,auVar97);
    auVar92 = vmulps_avx512vl(auVar88,auVar96);
    auVar92 = vfmsub231ps_avx512vl(auVar92,auVar140,auVar89);
    auVar93 = vmulps_avx512vl(auVar89,auVar112);
    auVar93 = vfmsub231ps_avx512vl(auVar93,auVar96,auVar87);
    auVar94 = vmulps_avx512vl(auVar87,auVar140);
    auVar94 = vfmsub231ps_avx512vl(auVar94,auVar112,auVar88);
    auVar94 = vmulps_avx512vl(auVar94,auVar94);
    auVar93 = vfmadd231ps_avx512vl(auVar94,auVar93,auVar93);
    auVar92 = vfmadd231ps_avx512vl(auVar93,auVar92,auVar92);
    auVar93 = vmulps_avx512vl(auVar89,auVar89);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar88,auVar88);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar87,auVar87);
    auVar94 = vrcp14ps_avx512vl(auVar93);
    auVar104 = vfnmadd213ps_avx512vl(auVar94,auVar93,auVar85);
    auVar94 = vfmadd132ps_avx512vl(auVar104,auVar94,auVar94);
    auVar92 = vmulps_avx512vl(auVar92,auVar94);
    auVar104 = vmulps_avx512vl(auVar88,auVar103);
    auVar104 = vfmsub231ps_avx512vl(auVar104,auVar102,auVar89);
    auVar105 = vmulps_avx512vl(auVar89,auVar101);
    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar103,auVar87);
    auVar106 = vmulps_avx512vl(auVar87,auVar102);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar101,auVar88);
    auVar106 = vmulps_avx512vl(auVar106,auVar106);
    auVar105 = vfmadd231ps_avx512vl(auVar106,auVar105,auVar105);
    auVar104 = vfmadd231ps_avx512vl(auVar105,auVar104,auVar104);
    auVar94 = vmulps_avx512vl(auVar104,auVar94);
    auVar92 = vmaxps_avx512vl(auVar92,auVar94);
    auVar92 = vsqrtps_avx512vl(auVar92);
    auVar94 = vmaxps_avx512vl(auVar86,auVar91);
    auVar84 = vmaxps_avx512vl(auVar84,auVar94);
    auVar94 = vaddps_avx512vl(auVar92,auVar84);
    auVar84 = vminps_avx(auVar86,auVar91);
    auVar84 = vminps_avx512vl(auVar90,auVar84);
    auVar84 = vsubps_avx512vl(auVar84,auVar92);
    auVar90._8_4_ = 0x3f800002;
    auVar90._0_8_ = 0x3f8000023f800002;
    auVar90._12_4_ = 0x3f800002;
    auVar90._16_4_ = 0x3f800002;
    auVar90._20_4_ = 0x3f800002;
    auVar90._24_4_ = 0x3f800002;
    auVar90._28_4_ = 0x3f800002;
    auVar86 = vmulps_avx512vl(auVar94,auVar90);
    auVar91._8_4_ = 0x3f7ffffc;
    auVar91._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar91._12_4_ = 0x3f7ffffc;
    auVar91._16_4_ = 0x3f7ffffc;
    auVar91._20_4_ = 0x3f7ffffc;
    auVar91._24_4_ = 0x3f7ffffc;
    auVar91._28_4_ = 0x3f7ffffc;
    local_760 = vmulps_avx512vl(auVar84,auVar91);
    auVar84 = vmulps_avx512vl(auVar86,auVar86);
    auVar86 = vrsqrt14ps_avx512vl(auVar93);
    auVar92._8_4_ = 0xbf000000;
    auVar92._0_8_ = 0xbf000000bf000000;
    auVar92._12_4_ = 0xbf000000;
    auVar92._16_4_ = 0xbf000000;
    auVar92._20_4_ = 0xbf000000;
    auVar92._24_4_ = 0xbf000000;
    auVar92._28_4_ = 0xbf000000;
    auVar90 = vmulps_avx512vl(auVar93,auVar92);
    fVar147 = auVar86._0_4_;
    fVar166 = auVar86._4_4_;
    fVar168 = auVar86._8_4_;
    fVar170 = auVar86._12_4_;
    fVar146 = auVar86._16_4_;
    fVar172 = auVar86._20_4_;
    fVar174 = auVar86._24_4_;
    auVar105._4_4_ = fVar166 * fVar166 * fVar166 * auVar90._4_4_;
    auVar105._0_4_ = fVar147 * fVar147 * fVar147 * auVar90._0_4_;
    auVar105._8_4_ = fVar168 * fVar168 * fVar168 * auVar90._8_4_;
    auVar105._12_4_ = fVar170 * fVar170 * fVar170 * auVar90._12_4_;
    auVar105._16_4_ = fVar146 * fVar146 * fVar146 * auVar90._16_4_;
    auVar105._20_4_ = fVar172 * fVar172 * fVar172 * auVar90._20_4_;
    auVar105._24_4_ = fVar174 * fVar174 * fVar174 * auVar90._24_4_;
    auVar105._28_4_ = auVar94._28_4_;
    auVar93._8_4_ = 0x3fc00000;
    auVar93._0_8_ = 0x3fc000003fc00000;
    auVar93._12_4_ = 0x3fc00000;
    auVar93._16_4_ = 0x3fc00000;
    auVar93._20_4_ = 0x3fc00000;
    auVar93._24_4_ = 0x3fc00000;
    auVar93._28_4_ = 0x3fc00000;
    auVar86 = vfmadd231ps_avx512vl(auVar105,auVar86,auVar93);
    auVar90 = vmulps_avx512vl(auVar87,auVar86);
    auVar91 = vmulps_avx512vl(auVar88,auVar86);
    auVar92 = vmulps_avx512vl(auVar89,auVar86);
    auVar219 = ZEXT1632(auVar79);
    auVar93 = vsubps_avx512vl(auVar109,auVar219);
    auVar104 = vsubps_avx512vl(auVar109,auVar95);
    auVar105 = vsubps_avx512vl(auVar109,auVar97);
    auVar94 = vmulps_avx512vl(local_3c0,auVar105);
    auVar94 = vfmadd231ps_avx512vl(auVar94,local_3a0,auVar104);
    auVar94 = vfmadd231ps_avx512vl(auVar94,_local_380,auVar93);
    auVar106 = vmulps_avx512vl(auVar105,auVar105);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar104,auVar104);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar93,auVar93);
    auVar107 = vmulps_avx512vl(local_3c0,auVar92);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar91,local_3a0);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar90,_local_380);
    auVar92 = vmulps_avx512vl(auVar105,auVar92);
    auVar91 = vfmadd231ps_avx512vl(auVar92,auVar104,auVar91);
    auVar90 = vfmadd231ps_avx512vl(auVar91,auVar93,auVar90);
    auVar91 = vmulps_avx512vl(auVar107,auVar107);
    auVar92 = vsubps_avx512vl(local_220,auVar91);
    auVar108 = vmulps_avx512vl(auVar107,auVar90);
    auVar94 = vsubps_avx512vl(auVar94,auVar108);
    auVar108 = vaddps_avx512vl(auVar94,auVar94);
    auVar94 = vmulps_avx512vl(auVar90,auVar90);
    local_780 = vsubps_avx512vl(auVar106,auVar94);
    auVar84 = vsubps_avx512vl(local_780,auVar84);
    local_660 = vmulps_avx512vl(auVar108,auVar108);
    auVar94._8_4_ = 0x40800000;
    auVar94._0_8_ = 0x4080000040800000;
    auVar94._12_4_ = 0x40800000;
    auVar94._16_4_ = 0x40800000;
    auVar94._20_4_ = 0x40800000;
    auVar94._24_4_ = 0x40800000;
    auVar94._28_4_ = 0x40800000;
    _local_4c0 = vmulps_avx512vl(auVar92,auVar94);
    auVar94 = vmulps_avx512vl(_local_4c0,auVar84);
    auVar94 = vsubps_avx512vl(local_660,auVar94);
    uVar67 = vcmpps_avx512vl(auVar94,auVar109,5);
    bVar56 = (byte)uVar67;
    fVar147 = (float)local_980._0_4_;
    fVar166 = (float)local_980._4_4_;
    fVar168 = fStack_978;
    fVar170 = fStack_974;
    fVar146 = fStack_970;
    fVar172 = fStack_96c;
    fVar174 = fStack_968;
    fVar176 = fStack_964;
    if (bVar56 == 0) {
LAB_01b6a083:
      auVar246 = ZEXT3264(local_820);
      auVar251 = ZEXT3264(local_840);
      auVar265 = ZEXT3264(local_880);
      auVar221 = ZEXT3264(local_5e0);
      auVar241 = ZEXT3264(local_860);
      auVar254 = ZEXT3264(local_8a0);
      auVar255 = ZEXT3264(local_8c0);
      auVar256 = ZEXT3264(local_8e0);
      auVar257 = ZEXT3264(local_900);
      auVar258 = ZEXT3264(local_7a0);
      auVar259 = ZEXT3264(local_920);
      auVar260 = ZEXT3264(local_7c0);
      auVar261 = ZEXT3264(local_940);
      auVar262 = ZEXT3264(local_960);
      auVar263 = ZEXT3264(local_7e0);
    }
    else {
      auVar94 = vsqrtps_avx512vl(auVar94);
      auVar109 = vaddps_avx512vl(auVar92,auVar92);
      local_680 = vrcp14ps_avx512vl(auVar109);
      auVar85 = vfnmadd213ps_avx512vl(local_680,auVar109,auVar85);
      auVar106 = vfmadd132ps_avx512vl(auVar85,local_680,local_680);
      auVar85._8_4_ = 0x80000000;
      auVar85._0_8_ = 0x8000000080000000;
      auVar85._12_4_ = 0x80000000;
      auVar85._16_4_ = 0x80000000;
      auVar85._20_4_ = 0x80000000;
      auVar85._24_4_ = 0x80000000;
      auVar85._28_4_ = 0x80000000;
      local_6e0 = vxorps_avx512vl(auVar108,auVar85);
      auVar85 = vsubps_avx512vl(local_6e0,auVar94);
      local_4e0 = vmulps_avx512vl(auVar85,auVar106);
      auVar94 = vsubps_avx512vl(auVar94,auVar108);
      local_500 = vmulps_avx512vl(auVar94,auVar106);
      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar85 = vblendmps_avx512vl(auVar94,local_4e0);
      auVar110._0_4_ =
           (uint)(bVar56 & 1) * auVar85._0_4_ | (uint)!(bool)(bVar56 & 1) * auVar94._0_4_;
      bVar65 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar110._4_4_ = (uint)bVar65 * auVar85._4_4_ | (uint)!bVar65 * auVar94._4_4_;
      bVar65 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar110._8_4_ = (uint)bVar65 * auVar85._8_4_ | (uint)!bVar65 * auVar94._8_4_;
      bVar65 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar110._12_4_ = (uint)bVar65 * auVar85._12_4_ | (uint)!bVar65 * auVar94._12_4_;
      bVar65 = (bool)((byte)(uVar67 >> 4) & 1);
      auVar110._16_4_ = (uint)bVar65 * auVar85._16_4_ | (uint)!bVar65 * auVar94._16_4_;
      bVar65 = (bool)((byte)(uVar67 >> 5) & 1);
      auVar110._20_4_ = (uint)bVar65 * auVar85._20_4_ | (uint)!bVar65 * auVar94._20_4_;
      bVar65 = (bool)((byte)(uVar67 >> 6) & 1);
      auVar110._24_4_ = (uint)bVar65 * auVar85._24_4_ | (uint)!bVar65 * auVar94._24_4_;
      bVar65 = SUB81(uVar67 >> 7,0);
      auVar110._28_4_ = (uint)bVar65 * auVar85._28_4_ | (uint)!bVar65 * auVar94._28_4_;
      auVar94 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar85 = vblendmps_avx512vl(auVar94,local_500);
      auVar111._0_4_ =
           (uint)(bVar56 & 1) * auVar85._0_4_ | (uint)!(bool)(bVar56 & 1) * auVar94._0_4_;
      bVar65 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar111._4_4_ = (uint)bVar65 * auVar85._4_4_ | (uint)!bVar65 * auVar94._4_4_;
      bVar65 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar111._8_4_ = (uint)bVar65 * auVar85._8_4_ | (uint)!bVar65 * auVar94._8_4_;
      bVar65 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar111._12_4_ = (uint)bVar65 * auVar85._12_4_ | (uint)!bVar65 * auVar94._12_4_;
      bVar65 = (bool)((byte)(uVar67 >> 4) & 1);
      auVar111._16_4_ = (uint)bVar65 * auVar85._16_4_ | (uint)!bVar65 * auVar94._16_4_;
      bVar65 = (bool)((byte)(uVar67 >> 5) & 1);
      auVar111._20_4_ = (uint)bVar65 * auVar85._20_4_ | (uint)!bVar65 * auVar94._20_4_;
      bVar65 = (bool)((byte)(uVar67 >> 6) & 1);
      auVar111._24_4_ = (uint)bVar65 * auVar85._24_4_ | (uint)!bVar65 * auVar94._24_4_;
      bVar65 = SUB81(uVar67 >> 7,0);
      auVar111._28_4_ = (uint)bVar65 * auVar85._28_4_ | (uint)!bVar65 * auVar94._28_4_;
      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar91,auVar94);
      local_520 = vmaxps_avx512vl(local_240,auVar94);
      auVar106._8_4_ = 0x36000000;
      auVar106._0_8_ = 0x3600000036000000;
      auVar106._12_4_ = 0x36000000;
      auVar106._16_4_ = 0x36000000;
      auVar106._20_4_ = 0x36000000;
      auVar106._24_4_ = 0x36000000;
      auVar106._28_4_ = 0x36000000;
      local_540 = vmulps_avx512vl(local_520,auVar106);
      vandps_avx512vl(auVar92,auVar94);
      uVar68 = vcmpps_avx512vl(local_540,local_540,1);
      uVar67 = uVar67 & uVar68;
      bVar59 = (byte)uVar67;
      if (bVar59 != 0) {
        uVar68 = vcmpps_avx512vl(auVar84,_DAT_01faff00,2);
        auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar91 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar92 = vblendmps_avx512vl(auVar84,auVar91);
        bVar61 = (byte)uVar68;
        uVar70 = (uint)(bVar61 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar61 & 1) * local_540._0_4_;
        bVar65 = (bool)((byte)(uVar68 >> 1) & 1);
        uVar69 = (uint)bVar65 * auVar92._4_4_ | (uint)!bVar65 * local_540._4_4_;
        bVar65 = (bool)((byte)(uVar68 >> 2) & 1);
        uVar121 = (uint)bVar65 * auVar92._8_4_ | (uint)!bVar65 * local_540._8_4_;
        bVar65 = (bool)((byte)(uVar68 >> 3) & 1);
        uVar122 = (uint)bVar65 * auVar92._12_4_ | (uint)!bVar65 * local_540._12_4_;
        bVar65 = (bool)((byte)(uVar68 >> 4) & 1);
        uVar123 = (uint)bVar65 * auVar92._16_4_ | (uint)!bVar65 * local_540._16_4_;
        bVar65 = (bool)((byte)(uVar68 >> 5) & 1);
        uVar124 = (uint)bVar65 * auVar92._20_4_ | (uint)!bVar65 * local_540._20_4_;
        bVar65 = (bool)((byte)(uVar68 >> 6) & 1);
        uVar125 = (uint)bVar65 * auVar92._24_4_ | (uint)!bVar65 * local_540._24_4_;
        bVar65 = SUB81(uVar68 >> 7,0);
        uVar126 = (uint)bVar65 * auVar92._28_4_ | (uint)!bVar65 * local_540._28_4_;
        auVar110._0_4_ = (bVar59 & 1) * uVar70 | !(bool)(bVar59 & 1) * auVar110._0_4_;
        bVar65 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar110._4_4_ = bVar65 * uVar69 | !bVar65 * auVar110._4_4_;
        bVar65 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar110._8_4_ = bVar65 * uVar121 | !bVar65 * auVar110._8_4_;
        bVar65 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar110._12_4_ = bVar65 * uVar122 | !bVar65 * auVar110._12_4_;
        bVar65 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar110._16_4_ = bVar65 * uVar123 | !bVar65 * auVar110._16_4_;
        bVar65 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar110._20_4_ = bVar65 * uVar124 | !bVar65 * auVar110._20_4_;
        bVar65 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar110._24_4_ = bVar65 * uVar125 | !bVar65 * auVar110._24_4_;
        bVar65 = SUB81(uVar67 >> 7,0);
        auVar110._28_4_ = bVar65 * uVar126 | !bVar65 * auVar110._28_4_;
        auVar84 = vblendmps_avx512vl(auVar91,auVar84);
        bVar65 = (bool)((byte)(uVar68 >> 1) & 1);
        bVar9 = (bool)((byte)(uVar68 >> 2) & 1);
        bVar10 = (bool)((byte)(uVar68 >> 3) & 1);
        bVar11 = (bool)((byte)(uVar68 >> 4) & 1);
        bVar12 = (bool)((byte)(uVar68 >> 5) & 1);
        bVar13 = (bool)((byte)(uVar68 >> 6) & 1);
        bVar14 = SUB81(uVar68 >> 7,0);
        auVar111._0_4_ =
             (uint)(bVar59 & 1) *
             ((uint)(bVar61 & 1) * auVar84._0_4_ | !(bool)(bVar61 & 1) * uVar70) |
             !(bool)(bVar59 & 1) * auVar111._0_4_;
        bVar8 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar111._4_4_ =
             (uint)bVar8 * ((uint)bVar65 * auVar84._4_4_ | !bVar65 * uVar69) |
             !bVar8 * auVar111._4_4_;
        bVar65 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar111._8_4_ =
             (uint)bVar65 * ((uint)bVar9 * auVar84._8_4_ | !bVar9 * uVar121) |
             !bVar65 * auVar111._8_4_;
        bVar65 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar111._12_4_ =
             (uint)bVar65 * ((uint)bVar10 * auVar84._12_4_ | !bVar10 * uVar122) |
             !bVar65 * auVar111._12_4_;
        bVar65 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar111._16_4_ =
             (uint)bVar65 * ((uint)bVar11 * auVar84._16_4_ | !bVar11 * uVar123) |
             !bVar65 * auVar111._16_4_;
        bVar65 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar111._20_4_ =
             (uint)bVar65 * ((uint)bVar12 * auVar84._20_4_ | !bVar12 * uVar124) |
             !bVar65 * auVar111._20_4_;
        bVar65 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar111._24_4_ =
             (uint)bVar65 * ((uint)bVar13 * auVar84._24_4_ | !bVar13 * uVar125) |
             !bVar65 * auVar111._24_4_;
        bVar65 = SUB81(uVar67 >> 7,0);
        auVar111._28_4_ =
             (uint)bVar65 * ((uint)bVar14 * auVar84._28_4_ | !bVar14 * uVar126) |
             !bVar65 * auVar111._28_4_;
        bVar56 = (~bVar59 | bVar61) & bVar56;
      }
      if ((bVar56 & 0x7f) == 0) goto LAB_01b6a083;
      auVar84 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar91 = vxorps_avx512vl(auVar103,auVar84);
      auVar92 = vxorps_avx512vl(auVar101,auVar84);
      uVar70 = *(uint *)(ray + k * 4 + 0x80);
      auVar94 = vxorps_avx512vl(auVar102,auVar84);
      auVar75 = vsubss_avx512f(ZEXT416(uVar70),ZEXT416((uint)local_640._0_4_));
      auVar101 = vbroadcastss_avx512vl(auVar75);
      auVar101 = vminps_avx512vl(auVar101,auVar111);
      auVar55._4_4_ = fStack_25c;
      auVar55._0_4_ = local_260;
      auVar55._8_4_ = fStack_258;
      auVar55._12_4_ = fStack_254;
      auVar55._16_4_ = fStack_250;
      auVar55._20_4_ = fStack_24c;
      auVar55._24_4_ = fStack_248;
      auVar55._28_4_ = fStack_244;
      auVar85 = vmaxps_avx512vl(auVar55,auVar110);
      auVar105 = vmulps_avx512vl(auVar105,auVar96);
      auVar104 = vfmadd213ps_avx512vl(auVar104,auVar140,auVar105);
      auVar75 = vfmadd213ps_fma(auVar93,auVar112,auVar104);
      auVar93 = vmulps_avx512vl(local_3c0,auVar96);
      auVar93 = vfmadd231ps_avx512vl(auVar93,local_3a0,auVar140);
      auVar74 = vfmadd231ps_fma(auVar93,_local_380,auVar112);
      auVar93 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(ZEXT1632(auVar74),auVar93);
      auVar96 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar15 = vcmpps_avx512vl(auVar93,auVar96,1);
      auVar104 = vxorps_avx512vl(ZEXT1632(auVar75),auVar84);
      auVar105 = vrcp14ps_avx512vl(ZEXT1632(auVar74));
      auVar140 = ZEXT1632(auVar74);
      auVar102 = vxorps_avx512vl(auVar140,auVar84);
      auVar106 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar103 = vfnmadd213ps_avx512vl(auVar105,auVar140,auVar106);
      auVar75 = vfmadd132ps_fma(auVar103,auVar105,auVar105);
      fVar148 = auVar75._0_4_ * auVar104._0_4_;
      fVar167 = auVar75._4_4_ * auVar104._4_4_;
      auVar103._4_4_ = fVar167;
      auVar103._0_4_ = fVar148;
      fVar169 = auVar75._8_4_ * auVar104._8_4_;
      auVar103._8_4_ = fVar169;
      fVar171 = auVar75._12_4_ * auVar104._12_4_;
      auVar103._12_4_ = fVar171;
      fVar173 = auVar104._16_4_ * 0.0;
      auVar103._16_4_ = fVar173;
      fVar175 = auVar104._20_4_ * 0.0;
      auVar103._20_4_ = fVar175;
      fVar177 = auVar104._24_4_ * 0.0;
      auVar103._24_4_ = fVar177;
      auVar103._28_4_ = auVar104._28_4_;
      uVar16 = vcmpps_avx512vl(auVar140,auVar102,1);
      bVar59 = (byte)uVar15 | (byte)uVar16;
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar103 = vblendmps_avx512vl(auVar103,auVar112);
      auVar113._0_4_ =
           (uint)(bVar59 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar105._0_4_;
      bVar65 = (bool)(bVar59 >> 1 & 1);
      auVar113._4_4_ = (uint)bVar65 * auVar103._4_4_ | (uint)!bVar65 * auVar105._4_4_;
      bVar65 = (bool)(bVar59 >> 2 & 1);
      auVar113._8_4_ = (uint)bVar65 * auVar103._8_4_ | (uint)!bVar65 * auVar105._8_4_;
      bVar65 = (bool)(bVar59 >> 3 & 1);
      auVar113._12_4_ = (uint)bVar65 * auVar103._12_4_ | (uint)!bVar65 * auVar105._12_4_;
      bVar65 = (bool)(bVar59 >> 4 & 1);
      auVar113._16_4_ = (uint)bVar65 * auVar103._16_4_ | (uint)!bVar65 * auVar105._16_4_;
      bVar65 = (bool)(bVar59 >> 5 & 1);
      auVar113._20_4_ = (uint)bVar65 * auVar103._20_4_ | (uint)!bVar65 * auVar105._20_4_;
      bVar65 = (bool)(bVar59 >> 6 & 1);
      auVar113._24_4_ = (uint)bVar65 * auVar103._24_4_ | (uint)!bVar65 * auVar105._24_4_;
      auVar113._28_4_ =
           (uint)(bVar59 >> 7) * auVar103._28_4_ | (uint)!(bool)(bVar59 >> 7) * auVar105._28_4_;
      auVar105 = vmaxps_avx512vl(auVar85,auVar113);
      uVar16 = vcmpps_avx512vl(auVar140,auVar102,6);
      bVar59 = (byte)uVar15 | (byte)uVar16;
      auVar114._0_4_ = (uint)(bVar59 & 1) * 0x7f800000 | (uint)!(bool)(bVar59 & 1) * (int)fVar148;
      bVar65 = (bool)(bVar59 >> 1 & 1);
      auVar114._4_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar167;
      bVar65 = (bool)(bVar59 >> 2 & 1);
      auVar114._8_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar169;
      bVar65 = (bool)(bVar59 >> 3 & 1);
      auVar114._12_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar171;
      bVar65 = (bool)(bVar59 >> 4 & 1);
      auVar114._16_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar173;
      bVar65 = (bool)(bVar59 >> 5 & 1);
      auVar114._20_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar175;
      bVar65 = (bool)(bVar59 >> 6 & 1);
      auVar114._24_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar177;
      auVar114._28_4_ =
           (uint)(bVar59 >> 7) * 0x7f800000 | (uint)!(bool)(bVar59 >> 7) * auVar104._28_4_;
      auVar104 = vminps_avx512vl(auVar101,auVar114);
      auVar75 = vxorps_avx512vl(auVar85._0_16_,auVar85._0_16_);
      auVar98 = vsubps_avx512vl(ZEXT1632(auVar75),auVar98);
      auVar99 = vsubps_avx512vl(ZEXT1632(auVar75),auVar99);
      auVar85 = ZEXT1632(auVar75);
      auVar100 = vsubps_avx512vl(auVar85,auVar100);
      auVar100 = vmulps_avx512vl(auVar100,auVar91);
      auVar99 = vfmadd231ps_avx512vl(auVar100,auVar94,auVar99);
      auVar98 = vfmadd231ps_avx512vl(auVar99,auVar92,auVar98);
      auVar91 = vmulps_avx512vl(local_3c0,auVar91);
      auVar91 = vfmadd231ps_avx512vl(auVar91,local_3a0,auVar94);
      auVar91 = vfmadd231ps_avx512vl(auVar91,_local_380,auVar92);
      vandps_avx512vl(auVar91,auVar93);
      uVar15 = vcmpps_avx512vl(auVar91,auVar96,1);
      auVar92 = vxorps_avx512vl(auVar98,auVar84);
      auVar93 = vrcp14ps_avx512vl(auVar91);
      auVar84 = vxorps_avx512vl(auVar91,auVar84);
      auVar94 = vfnmadd213ps_avx512vl(auVar93,auVar91,auVar106);
      auVar75 = vfmadd132ps_fma(auVar94,auVar93,auVar93);
      fVar148 = auVar75._0_4_ * auVar92._0_4_;
      fVar167 = auVar75._4_4_ * auVar92._4_4_;
      auVar41._4_4_ = fVar167;
      auVar41._0_4_ = fVar148;
      fVar169 = auVar75._8_4_ * auVar92._8_4_;
      auVar41._8_4_ = fVar169;
      fVar171 = auVar75._12_4_ * auVar92._12_4_;
      auVar41._12_4_ = fVar171;
      fVar173 = auVar92._16_4_ * 0.0;
      auVar41._16_4_ = fVar173;
      fVar175 = auVar92._20_4_ * 0.0;
      auVar41._20_4_ = fVar175;
      fVar177 = auVar92._24_4_ * 0.0;
      auVar41._24_4_ = fVar177;
      auVar41._28_4_ = auVar92._28_4_;
      uVar16 = vcmpps_avx512vl(auVar91,auVar84,1);
      bVar59 = (byte)uVar15 | (byte)uVar16;
      auVar94 = vblendmps_avx512vl(auVar41,auVar112);
      auVar115._0_4_ =
           (uint)(bVar59 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar93._0_4_;
      bVar65 = (bool)(bVar59 >> 1 & 1);
      auVar115._4_4_ = (uint)bVar65 * auVar94._4_4_ | (uint)!bVar65 * auVar93._4_4_;
      bVar65 = (bool)(bVar59 >> 2 & 1);
      auVar115._8_4_ = (uint)bVar65 * auVar94._8_4_ | (uint)!bVar65 * auVar93._8_4_;
      bVar65 = (bool)(bVar59 >> 3 & 1);
      auVar115._12_4_ = (uint)bVar65 * auVar94._12_4_ | (uint)!bVar65 * auVar93._12_4_;
      bVar65 = (bool)(bVar59 >> 4 & 1);
      auVar115._16_4_ = (uint)bVar65 * auVar94._16_4_ | (uint)!bVar65 * auVar93._16_4_;
      bVar65 = (bool)(bVar59 >> 5 & 1);
      auVar115._20_4_ = (uint)bVar65 * auVar94._20_4_ | (uint)!bVar65 * auVar93._20_4_;
      bVar65 = (bool)(bVar59 >> 6 & 1);
      auVar115._24_4_ = (uint)bVar65 * auVar94._24_4_ | (uint)!bVar65 * auVar93._24_4_;
      auVar115._28_4_ =
           (uint)(bVar59 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar59 >> 7) * auVar93._28_4_;
      _local_800 = vmaxps_avx(auVar105,auVar115);
      uVar16 = vcmpps_avx512vl(auVar91,auVar84,6);
      bVar59 = (byte)uVar15 | (byte)uVar16;
      auVar116._0_4_ = (uint)(bVar59 & 1) * 0x7f800000 | (uint)!(bool)(bVar59 & 1) * (int)fVar148;
      bVar65 = (bool)(bVar59 >> 1 & 1);
      auVar116._4_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar167;
      bVar65 = (bool)(bVar59 >> 2 & 1);
      auVar116._8_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar169;
      bVar65 = (bool)(bVar59 >> 3 & 1);
      auVar116._12_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar171;
      bVar65 = (bool)(bVar59 >> 4 & 1);
      auVar116._16_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar173;
      bVar65 = (bool)(bVar59 >> 5 & 1);
      auVar116._20_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar175;
      bVar65 = (bool)(bVar59 >> 6 & 1);
      auVar116._24_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar177;
      auVar116._28_4_ =
           (uint)(bVar59 >> 7) * 0x7f800000 | (uint)!(bool)(bVar59 >> 7) * auVar92._28_4_;
      local_2c0 = vminps_avx(auVar104,auVar116);
      uVar15 = vcmpps_avx512vl(_local_800,local_2c0,2);
      bVar56 = bVar56 & 0x7f & (byte)uVar15;
      if (bVar56 == 0) {
        auVar266 = ZEXT3264(local_700);
        goto LAB_01b6a083;
      }
      auVar91 = vmaxps_avx512vl(auVar85,local_760);
      auVar84 = vfmadd213ps_avx512vl(local_4e0,auVar107,auVar90);
      fVar148 = auVar86._0_4_;
      fVar167 = auVar86._4_4_;
      auVar42._4_4_ = fVar167 * auVar84._4_4_;
      auVar42._0_4_ = fVar148 * auVar84._0_4_;
      fVar169 = auVar86._8_4_;
      auVar42._8_4_ = fVar169 * auVar84._8_4_;
      fVar171 = auVar86._12_4_;
      auVar42._12_4_ = fVar171 * auVar84._12_4_;
      fVar173 = auVar86._16_4_;
      auVar42._16_4_ = fVar173 * auVar84._16_4_;
      fVar175 = auVar86._20_4_;
      auVar42._20_4_ = fVar175 * auVar84._20_4_;
      fVar177 = auVar86._24_4_;
      auVar42._24_4_ = fVar177 * auVar84._24_4_;
      auVar42._28_4_ = auVar84._28_4_;
      auVar84 = vfmadd213ps_avx512vl(local_500,auVar107,auVar90);
      auVar43._4_4_ = fVar167 * auVar84._4_4_;
      auVar43._0_4_ = fVar148 * auVar84._0_4_;
      auVar43._8_4_ = fVar169 * auVar84._8_4_;
      auVar43._12_4_ = fVar171 * auVar84._12_4_;
      auVar43._16_4_ = fVar173 * auVar84._16_4_;
      auVar43._20_4_ = fVar175 * auVar84._20_4_;
      auVar43._24_4_ = fVar177 * auVar84._24_4_;
      auVar43._28_4_ = auVar115._28_4_;
      auVar84 = vminps_avx512vl(auVar42,auVar106);
      auVar51 = ZEXT812(0);
      auVar92 = ZEXT1232(auVar51) << 0x20;
      auVar84 = vmaxps_avx(auVar84,ZEXT1232(auVar51) << 0x20);
      auVar93 = vminps_avx512vl(auVar43,auVar106);
      auVar44._4_4_ = (auVar84._4_4_ + 1.0) * 0.125;
      auVar44._0_4_ = (auVar84._0_4_ + 0.0) * 0.125;
      auVar44._8_4_ = (auVar84._8_4_ + 2.0) * 0.125;
      auVar44._12_4_ = (auVar84._12_4_ + 3.0) * 0.125;
      auVar44._16_4_ = (auVar84._16_4_ + 4.0) * 0.125;
      auVar44._20_4_ = (auVar84._20_4_ + 5.0) * 0.125;
      auVar44._24_4_ = (auVar84._24_4_ + 6.0) * 0.125;
      auVar44._28_4_ = auVar84._28_4_ + 7.0;
      auVar75 = vfmadd213ps_fma(auVar44,local_6c0,auVar209);
      local_1e0 = ZEXT1632(auVar75);
      auVar84 = vmaxps_avx(auVar93,ZEXT1232(auVar51) << 0x20);
      auVar45._4_4_ = (auVar84._4_4_ + 1.0) * 0.125;
      auVar45._0_4_ = (auVar84._0_4_ + 0.0) * 0.125;
      auVar45._8_4_ = (auVar84._8_4_ + 2.0) * 0.125;
      auVar45._12_4_ = (auVar84._12_4_ + 3.0) * 0.125;
      auVar45._16_4_ = (auVar84._16_4_ + 4.0) * 0.125;
      auVar45._20_4_ = (auVar84._20_4_ + 5.0) * 0.125;
      auVar45._24_4_ = (auVar84._24_4_ + 6.0) * 0.125;
      auVar45._28_4_ = auVar84._28_4_ + 7.0;
      auVar75 = vfmadd213ps_fma(auVar45,local_6c0,auVar209);
      local_200 = ZEXT1632(auVar75);
      auVar46._4_4_ = auVar91._4_4_ * auVar91._4_4_;
      auVar46._0_4_ = auVar91._0_4_ * auVar91._0_4_;
      auVar46._8_4_ = auVar91._8_4_ * auVar91._8_4_;
      auVar46._12_4_ = auVar91._12_4_ * auVar91._12_4_;
      auVar46._16_4_ = auVar91._16_4_ * auVar91._16_4_;
      auVar46._20_4_ = auVar91._20_4_ * auVar91._20_4_;
      auVar46._24_4_ = auVar91._24_4_ * auVar91._24_4_;
      auVar46._28_4_ = auVar91._28_4_;
      auVar84 = vsubps_avx(local_780,auVar46);
      auVar47._4_4_ = auVar84._4_4_ * (float)local_4c0._4_4_;
      auVar47._0_4_ = auVar84._0_4_ * (float)local_4c0._0_4_;
      auVar47._8_4_ = auVar84._8_4_ * fStack_4b8;
      auVar47._12_4_ = auVar84._12_4_ * fStack_4b4;
      auVar47._16_4_ = auVar84._16_4_ * fStack_4b0;
      auVar47._20_4_ = auVar84._20_4_ * fStack_4ac;
      auVar47._24_4_ = auVar84._24_4_ * fStack_4a8;
      auVar47._28_4_ = auVar91._28_4_;
      auVar91 = vsubps_avx(local_660,auVar47);
      uVar67 = vcmpps_avx512vl(auVar91,ZEXT1232(auVar51) << 0x20,5);
      auVar266 = ZEXT3264(local_700);
      auVar263 = ZEXT3264(local_7e0);
      if ((byte)uVar67 == 0) {
        uVar67 = 0;
        auVar86 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar221 = ZEXT864(0) << 0x20;
        auVar91 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar93 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar247 = ZEXT1228(ZEXT812(0)) << 0x20;
        auVar107._8_4_ = 0x7f800000;
        auVar107._0_8_ = 0x7f8000007f800000;
        auVar107._12_4_ = 0x7f800000;
        auVar107._16_4_ = 0x7f800000;
        auVar107._20_4_ = 0x7f800000;
        auVar107._24_4_ = 0x7f800000;
        auVar107._28_4_ = 0x7f800000;
        auVar108._8_4_ = 0xff800000;
        auVar108._0_8_ = 0xff800000ff800000;
        auVar108._12_4_ = 0xff800000;
        auVar108._16_4_ = 0xff800000;
        auVar108._20_4_ = 0xff800000;
        auVar108._24_4_ = 0xff800000;
        auVar108._28_4_ = 0xff800000;
      }
      else {
        auVar74 = vxorps_avx512vl(auVar101._0_16_,auVar101._0_16_);
        uVar68 = vcmpps_avx512vl(auVar91,auVar85,5);
        auVar91 = vsqrtps_avx(auVar91);
        auVar92 = vfnmadd213ps_avx512vl(auVar109,local_680,auVar106);
        auVar94 = vfmadd132ps_avx512vl(auVar92,local_680,local_680);
        auVar92 = vsubps_avx(local_6e0,auVar91);
        auVar98 = vmulps_avx512vl(auVar92,auVar94);
        auVar91 = vsubps_avx512vl(auVar91,auVar108);
        auVar94 = vmulps_avx512vl(auVar91,auVar94);
        auVar91 = vfmadd213ps_avx512vl(auVar107,auVar98,auVar90);
        auVar109._4_4_ = fVar167 * auVar91._4_4_;
        auVar109._0_4_ = fVar148 * auVar91._0_4_;
        auVar109._8_4_ = fVar169 * auVar91._8_4_;
        auVar109._12_4_ = fVar171 * auVar91._12_4_;
        auVar109._16_4_ = fVar173 * auVar91._16_4_;
        auVar109._20_4_ = fVar175 * auVar91._20_4_;
        auVar109._24_4_ = fVar177 * auVar91._24_4_;
        auVar109._28_4_ = auVar93._28_4_;
        auVar48._4_4_ = (float)local_380._4_4_ * auVar98._4_4_;
        auVar48._0_4_ = (float)local_380._0_4_ * auVar98._0_4_;
        auVar48._8_4_ = fStack_378 * auVar98._8_4_;
        auVar48._12_4_ = fStack_374 * auVar98._12_4_;
        auVar48._16_4_ = fStack_370 * auVar98._16_4_;
        auVar48._20_4_ = fStack_36c * auVar98._20_4_;
        auVar48._24_4_ = fStack_368 * auVar98._24_4_;
        auVar48._28_4_ = auVar91._28_4_;
        auVar92 = vmulps_avx512vl(local_3a0,auVar98);
        auVar99 = vmulps_avx512vl(local_3c0,auVar98);
        auVar91 = vfmadd213ps_avx512vl(auVar87,auVar109,auVar219);
        auVar91 = vsubps_avx512vl(auVar48,auVar91);
        auVar93 = vfmadd213ps_avx512vl(auVar88,auVar109,auVar95);
        auVar93 = vsubps_avx512vl(auVar92,auVar93);
        auVar75 = vfmadd213ps_fma(auVar109,auVar89,auVar97);
        auVar92 = vsubps_avx(auVar99,ZEXT1632(auVar75));
        auVar247 = auVar92._0_28_;
        auVar90 = vfmadd213ps_avx512vl(auVar107,auVar94,auVar90);
        auVar90 = vmulps_avx512vl(auVar86,auVar90);
        auVar49._4_4_ = (float)local_380._4_4_ * auVar94._4_4_;
        auVar49._0_4_ = (float)local_380._0_4_ * auVar94._0_4_;
        auVar49._8_4_ = fStack_378 * auVar94._8_4_;
        auVar49._12_4_ = fStack_374 * auVar94._12_4_;
        auVar49._16_4_ = fStack_370 * auVar94._16_4_;
        auVar49._20_4_ = fStack_36c * auVar94._20_4_;
        auVar49._24_4_ = fStack_368 * auVar94._24_4_;
        auVar49._28_4_ = auVar99._28_4_;
        auVar86 = vmulps_avx512vl(local_3a0,auVar94);
        auVar99 = vmulps_avx512vl(local_3c0,auVar94);
        auVar75 = vfmadd213ps_fma(auVar87,auVar90,auVar219);
        auVar92 = vsubps_avx(auVar49,ZEXT1632(auVar75));
        auVar75 = vfmadd213ps_fma(auVar88,auVar90,auVar95);
        auVar86 = vsubps_avx512vl(auVar86,ZEXT1632(auVar75));
        auVar75 = vfmadd213ps_fma(auVar89,auVar90,auVar97);
        auVar87 = vsubps_avx512vl(auVar99,ZEXT1632(auVar75));
        auVar221 = ZEXT3264(auVar87);
        auVar200._8_4_ = 0x7f800000;
        auVar200._0_8_ = 0x7f8000007f800000;
        auVar200._12_4_ = 0x7f800000;
        auVar200._16_4_ = 0x7f800000;
        auVar200._20_4_ = 0x7f800000;
        auVar200._24_4_ = 0x7f800000;
        auVar200._28_4_ = 0x7f800000;
        auVar87 = vblendmps_avx512vl(auVar200,auVar98);
        bVar65 = (bool)((byte)uVar68 & 1);
        auVar107._0_4_ = (uint)bVar65 * auVar87._0_4_ | (uint)!bVar65 * 0x7f800000;
        bVar65 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar107._4_4_ = (uint)bVar65 * auVar87._4_4_ | (uint)!bVar65 * 0x7f800000;
        bVar65 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar107._8_4_ = (uint)bVar65 * auVar87._8_4_ | (uint)!bVar65 * 0x7f800000;
        bVar65 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar107._12_4_ = (uint)bVar65 * auVar87._12_4_ | (uint)!bVar65 * 0x7f800000;
        bVar65 = (bool)((byte)(uVar68 >> 4) & 1);
        auVar107._16_4_ = (uint)bVar65 * auVar87._16_4_ | (uint)!bVar65 * 0x7f800000;
        bVar65 = (bool)((byte)(uVar68 >> 5) & 1);
        auVar107._20_4_ = (uint)bVar65 * auVar87._20_4_ | (uint)!bVar65 * 0x7f800000;
        bVar65 = (bool)((byte)(uVar68 >> 6) & 1);
        auVar107._24_4_ = (uint)bVar65 * auVar87._24_4_ | (uint)!bVar65 * 0x7f800000;
        bVar65 = SUB81(uVar68 >> 7,0);
        auVar107._28_4_ = (uint)bVar65 * auVar87._28_4_ | (uint)!bVar65 * 0x7f800000;
        auVar220._8_4_ = 0xff800000;
        auVar220._0_8_ = 0xff800000ff800000;
        auVar220._12_4_ = 0xff800000;
        auVar220._16_4_ = 0xff800000;
        auVar220._20_4_ = 0xff800000;
        auVar220._24_4_ = 0xff800000;
        auVar220._28_4_ = 0xff800000;
        auVar87 = vblendmps_avx512vl(auVar220,auVar94);
        bVar65 = (bool)((byte)uVar68 & 1);
        auVar108._0_4_ = (uint)bVar65 * auVar87._0_4_ | (uint)!bVar65 * -0x800000;
        bVar65 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar108._4_4_ = (uint)bVar65 * auVar87._4_4_ | (uint)!bVar65 * -0x800000;
        bVar65 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar108._8_4_ = (uint)bVar65 * auVar87._8_4_ | (uint)!bVar65 * -0x800000;
        bVar65 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar108._12_4_ = (uint)bVar65 * auVar87._12_4_ | (uint)!bVar65 * -0x800000;
        bVar65 = (bool)((byte)(uVar68 >> 4) & 1);
        auVar108._16_4_ = (uint)bVar65 * auVar87._16_4_ | (uint)!bVar65 * -0x800000;
        bVar65 = (bool)((byte)(uVar68 >> 5) & 1);
        auVar108._20_4_ = (uint)bVar65 * auVar87._20_4_ | (uint)!bVar65 * -0x800000;
        bVar65 = (bool)((byte)(uVar68 >> 6) & 1);
        auVar108._24_4_ = (uint)bVar65 * auVar87._24_4_ | (uint)!bVar65 * -0x800000;
        bVar65 = SUB81(uVar68 >> 7,0);
        auVar108._28_4_ = (uint)bVar65 * auVar87._28_4_ | (uint)!bVar65 * -0x800000;
        auVar219._8_4_ = 0x36000000;
        auVar219._0_8_ = 0x3600000036000000;
        auVar219._12_4_ = 0x36000000;
        auVar219._16_4_ = 0x36000000;
        auVar219._20_4_ = 0x36000000;
        auVar219._24_4_ = 0x36000000;
        auVar219._28_4_ = 0x36000000;
        auVar87 = vmulps_avx512vl(local_520,auVar219);
        uVar17 = vcmpps_avx512vl(auVar87,local_540,0xe);
        uVar68 = uVar68 & uVar17;
        bVar59 = (byte)uVar68;
        if (bVar59 != 0) {
          uVar17 = vcmpps_avx512vl(auVar84,ZEXT1632(auVar74),2);
          auVar244._8_4_ = 0x7f800000;
          auVar244._0_8_ = 0x7f8000007f800000;
          auVar244._12_4_ = 0x7f800000;
          auVar244._16_4_ = 0x7f800000;
          auVar244._20_4_ = 0x7f800000;
          auVar244._24_4_ = 0x7f800000;
          auVar244._28_4_ = 0x7f800000;
          auVar250._8_4_ = 0xff800000;
          auVar250._0_8_ = 0xff800000ff800000;
          auVar250._12_4_ = 0xff800000;
          auVar250._16_4_ = 0xff800000;
          auVar250._20_4_ = 0xff800000;
          auVar250._24_4_ = 0xff800000;
          auVar250._28_4_ = 0xff800000;
          auVar84 = vblendmps_avx512vl(auVar244,auVar250);
          bVar61 = (byte)uVar17;
          uVar69 = (uint)(bVar61 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar87._0_4_;
          bVar65 = (bool)((byte)(uVar17 >> 1) & 1);
          uVar121 = (uint)bVar65 * auVar84._4_4_ | (uint)!bVar65 * auVar87._4_4_;
          bVar65 = (bool)((byte)(uVar17 >> 2) & 1);
          uVar122 = (uint)bVar65 * auVar84._8_4_ | (uint)!bVar65 * auVar87._8_4_;
          bVar65 = (bool)((byte)(uVar17 >> 3) & 1);
          uVar123 = (uint)bVar65 * auVar84._12_4_ | (uint)!bVar65 * auVar87._12_4_;
          bVar65 = (bool)((byte)(uVar17 >> 4) & 1);
          uVar124 = (uint)bVar65 * auVar84._16_4_ | (uint)!bVar65 * auVar87._16_4_;
          bVar65 = (bool)((byte)(uVar17 >> 5) & 1);
          uVar125 = (uint)bVar65 * auVar84._20_4_ | (uint)!bVar65 * auVar87._20_4_;
          bVar65 = (bool)((byte)(uVar17 >> 6) & 1);
          uVar126 = (uint)bVar65 * auVar84._24_4_ | (uint)!bVar65 * auVar87._24_4_;
          bVar65 = SUB81(uVar17 >> 7,0);
          uVar127 = (uint)bVar65 * auVar84._28_4_ | (uint)!bVar65 * auVar87._28_4_;
          auVar107._0_4_ = (bVar59 & 1) * uVar69 | !(bool)(bVar59 & 1) * auVar107._0_4_;
          bVar65 = (bool)((byte)(uVar68 >> 1) & 1);
          auVar107._4_4_ = bVar65 * uVar121 | !bVar65 * auVar107._4_4_;
          bVar65 = (bool)((byte)(uVar68 >> 2) & 1);
          auVar107._8_4_ = bVar65 * uVar122 | !bVar65 * auVar107._8_4_;
          bVar65 = (bool)((byte)(uVar68 >> 3) & 1);
          auVar107._12_4_ = bVar65 * uVar123 | !bVar65 * auVar107._12_4_;
          bVar65 = (bool)((byte)(uVar68 >> 4) & 1);
          auVar107._16_4_ = bVar65 * uVar124 | !bVar65 * auVar107._16_4_;
          bVar65 = (bool)((byte)(uVar68 >> 5) & 1);
          auVar107._20_4_ = bVar65 * uVar125 | !bVar65 * auVar107._20_4_;
          bVar65 = (bool)((byte)(uVar68 >> 6) & 1);
          auVar107._24_4_ = bVar65 * uVar126 | !bVar65 * auVar107._24_4_;
          bVar65 = SUB81(uVar68 >> 7,0);
          auVar107._28_4_ = bVar65 * uVar127 | !bVar65 * auVar107._28_4_;
          auVar84 = vblendmps_avx512vl(auVar250,auVar244);
          bVar65 = (bool)((byte)(uVar17 >> 1) & 1);
          bVar9 = (bool)((byte)(uVar17 >> 2) & 1);
          bVar10 = (bool)((byte)(uVar17 >> 3) & 1);
          bVar11 = (bool)((byte)(uVar17 >> 4) & 1);
          bVar12 = (bool)((byte)(uVar17 >> 5) & 1);
          bVar13 = (bool)((byte)(uVar17 >> 6) & 1);
          bVar14 = SUB81(uVar17 >> 7,0);
          auVar108._0_4_ =
               (uint)(bVar59 & 1) *
               ((uint)(bVar61 & 1) * auVar84._0_4_ | !(bool)(bVar61 & 1) * uVar69) |
               !(bool)(bVar59 & 1) * auVar108._0_4_;
          bVar8 = (bool)((byte)(uVar68 >> 1) & 1);
          auVar108._4_4_ =
               (uint)bVar8 * ((uint)bVar65 * auVar84._4_4_ | !bVar65 * uVar121) |
               !bVar8 * auVar108._4_4_;
          bVar65 = (bool)((byte)(uVar68 >> 2) & 1);
          auVar108._8_4_ =
               (uint)bVar65 * ((uint)bVar9 * auVar84._8_4_ | !bVar9 * uVar122) |
               !bVar65 * auVar108._8_4_;
          bVar65 = (bool)((byte)(uVar68 >> 3) & 1);
          auVar108._12_4_ =
               (uint)bVar65 * ((uint)bVar10 * auVar84._12_4_ | !bVar10 * uVar123) |
               !bVar65 * auVar108._12_4_;
          bVar65 = (bool)((byte)(uVar68 >> 4) & 1);
          auVar108._16_4_ =
               (uint)bVar65 * ((uint)bVar11 * auVar84._16_4_ | !bVar11 * uVar124) |
               !bVar65 * auVar108._16_4_;
          bVar65 = (bool)((byte)(uVar68 >> 5) & 1);
          auVar108._20_4_ =
               (uint)bVar65 * ((uint)bVar12 * auVar84._20_4_ | !bVar12 * uVar125) |
               !bVar65 * auVar108._20_4_;
          bVar65 = (bool)((byte)(uVar68 >> 6) & 1);
          auVar108._24_4_ =
               (uint)bVar65 * ((uint)bVar13 * auVar84._24_4_ | !bVar13 * uVar126) |
               !bVar65 * auVar108._24_4_;
          bVar65 = SUB81(uVar68 >> 7,0);
          auVar108._28_4_ =
               (uint)bVar65 * ((uint)bVar14 * auVar84._28_4_ | !bVar14 * uVar127) |
               !bVar65 * auVar108._28_4_;
          uVar67 = (ulong)(byte)((~bVar59 | bVar61) & (byte)uVar67);
        }
      }
      auVar265 = ZEXT3264(local_880);
      auVar254 = ZEXT3264(local_8a0);
      auVar255 = ZEXT3264(local_8c0);
      auVar256 = ZEXT3264(local_8e0);
      auVar257 = ZEXT3264(local_900);
      auVar259 = ZEXT3264(local_920);
      auVar261 = ZEXT3264(local_940);
      auVar262 = ZEXT3264(local_960);
      auVar241._0_4_ = local_3c0._0_4_ * auVar221._0_4_;
      auVar241._4_4_ = local_3c0._4_4_ * auVar221._4_4_;
      auVar241._8_4_ = local_3c0._8_4_ * auVar221._8_4_;
      auVar241._12_4_ = local_3c0._12_4_ * auVar221._12_4_;
      auVar241._16_4_ = local_3c0._16_4_ * auVar221._16_4_;
      auVar241._20_4_ = local_3c0._20_4_ * auVar221._20_4_;
      auVar241._28_36_ = auVar221._28_36_;
      auVar241._24_4_ = local_3c0._24_4_ * auVar221._24_4_;
      auVar75 = vfmadd231ps_fma(auVar241._0_32_,local_3a0,auVar86);
      auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),_local_380,auVar92);
      auVar240._8_4_ = 0x7fffffff;
      auVar240._0_8_ = 0x7fffffff7fffffff;
      auVar240._12_4_ = 0x7fffffff;
      auVar240._16_4_ = 0x7fffffff;
      auVar240._20_4_ = 0x7fffffff;
      auVar240._24_4_ = 0x7fffffff;
      auVar240._28_4_ = 0x7fffffff;
      auVar84 = vandps_avx(ZEXT1632(auVar75),auVar240);
      _local_1c0 = _local_800;
      auVar231._8_4_ = 0x3e99999a;
      auVar231._0_8_ = 0x3e99999a3e99999a;
      auVar231._12_4_ = 0x3e99999a;
      auVar231._16_4_ = 0x3e99999a;
      auVar231._20_4_ = 0x3e99999a;
      auVar231._24_4_ = 0x3e99999a;
      auVar231._28_4_ = 0x3e99999a;
      uVar15 = vcmpps_avx512vl(auVar84,auVar231,1);
      local_360._0_2_ = (short)uVar15;
      auVar84 = vmaxps_avx(_local_800,auVar108);
      local_2e0 = auVar84;
      auVar86 = vminps_avx(local_2c0,auVar107);
      uVar15 = vcmpps_avx512vl(_local_800,auVar86,2);
      bVar59 = (byte)uVar15 & bVar56;
      uVar16 = vcmpps_avx512vl(auVar84,local_2c0,2);
      auVar258 = ZEXT3264(local_7a0);
      auVar260 = ZEXT3264(local_7c0);
      if ((bVar56 & ((byte)uVar16 | (byte)uVar15)) == 0) {
        auVar246 = ZEXT3264(local_820);
        auVar251 = ZEXT3264(local_840);
        auVar221 = ZEXT3264(local_5e0);
        auVar241 = ZEXT3264(local_860);
      }
      else {
        uVar68 = CONCAT71((int7)(uVar67 >> 8),~(byte)uVar67);
        auVar50._4_4_ = local_3c0._4_4_ * auVar247._4_4_;
        auVar50._0_4_ = local_3c0._0_4_ * auVar247._0_4_;
        auVar50._8_4_ = local_3c0._8_4_ * auVar247._8_4_;
        auVar50._12_4_ = local_3c0._12_4_ * auVar247._12_4_;
        auVar50._16_4_ = local_3c0._16_4_ * auVar247._16_4_;
        auVar50._20_4_ = local_3c0._20_4_ * auVar247._20_4_;
        auVar50._24_4_ = local_3c0._24_4_ * auVar247._24_4_;
        auVar50._28_4_ = auVar86._28_4_;
        auVar75 = vfmadd213ps_fma(auVar93,local_3a0,auVar50);
        auVar75 = vfmadd213ps_fma(auVar91,_local_380,ZEXT1632(auVar75));
        auVar86 = vandps_avx(ZEXT1632(auVar75),auVar240);
        uVar15 = vcmpps_avx512vl(auVar86,auVar231,1);
        bVar61 = (byte)uVar15 | ~(byte)uVar67;
        auVar142._8_4_ = 2;
        auVar142._0_8_ = 0x200000002;
        auVar142._12_4_ = 2;
        auVar142._16_4_ = 2;
        auVar142._20_4_ = 2;
        auVar142._24_4_ = 2;
        auVar142._28_4_ = 2;
        auVar38._8_4_ = 3;
        auVar38._0_8_ = 0x300000003;
        auVar38._12_4_ = 3;
        auVar38._16_4_ = 3;
        auVar38._20_4_ = 3;
        auVar38._24_4_ = 3;
        auVar38._28_4_ = 3;
        auVar86 = vpblendmd_avx512vl(auVar142,auVar38);
        local_280._0_4_ = (uint)(bVar61 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar61 & 1) * 2;
        bVar65 = (bool)(bVar61 >> 1 & 1);
        local_280._4_4_ = (uint)bVar65 * auVar86._4_4_ | (uint)!bVar65 * 2;
        bVar65 = (bool)(bVar61 >> 2 & 1);
        local_280._8_4_ = (uint)bVar65 * auVar86._8_4_ | (uint)!bVar65 * 2;
        bVar65 = (bool)(bVar61 >> 3 & 1);
        local_280._12_4_ = (uint)bVar65 * auVar86._12_4_ | (uint)!bVar65 * 2;
        bVar65 = (bool)(bVar61 >> 4 & 1);
        local_280._16_4_ = (uint)bVar65 * auVar86._16_4_ | (uint)!bVar65 * 2;
        bVar65 = (bool)(bVar61 >> 5 & 1);
        local_280._20_4_ = (uint)bVar65 * auVar86._20_4_ | (uint)!bVar65 * 2;
        bVar65 = (bool)(bVar61 >> 6 & 1);
        local_280._24_4_ = (uint)bVar65 * auVar86._24_4_ | (uint)!bVar65 * 2;
        local_280._28_4_ = (uint)(bVar61 >> 7) * auVar86._28_4_ | (uint)!(bool)(bVar61 >> 7) * 2;
        local_300 = vpbroadcastd_avx512vl();
        uVar15 = vpcmpd_avx512vl(local_300,local_280,5);
        bVar61 = (byte)uVar15 & bVar59;
        auVar246 = ZEXT3264(local_820);
        if (bVar61 == 0) {
          auVar144._4_4_ = uVar70;
          auVar144._0_4_ = uVar70;
          auVar144._8_4_ = uVar70;
          auVar144._12_4_ = uVar70;
          auVar144._16_4_ = uVar70;
          auVar144._20_4_ = uVar70;
          auVar144._24_4_ = uVar70;
          auVar144._28_4_ = uVar70;
          auVar251 = ZEXT3264(local_840);
          auVar241 = ZEXT3264(local_860);
        }
        else {
          local_2a0 = auVar84;
          local_990 = (uint)uVar68;
          auVar74 = vminps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar75 = vmaxps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar77 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar78 = vminps_avx(auVar74,auVar77);
          auVar74 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar77 = vmaxps_avx(auVar75,auVar74);
          auVar181._8_4_ = 0x7fffffff;
          auVar181._0_8_ = 0x7fffffff7fffffff;
          auVar181._12_4_ = 0x7fffffff;
          auVar75 = vandps_avx(auVar78,auVar181);
          auVar74 = vandps_avx(auVar77,auVar181);
          auVar75 = vmaxps_avx(auVar75,auVar74);
          auVar74 = vmovshdup_avx(auVar75);
          auVar74 = vmaxss_avx(auVar74,auVar75);
          auVar75 = vshufpd_avx(auVar75,auVar75,1);
          auVar75 = vmaxss_avx(auVar75,auVar74);
          fVar148 = auVar75._0_4_ * 1.9073486e-06;
          local_630 = vshufps_avx(auVar77,auVar77,0xff);
          local_340 = (float)local_800._0_4_ + (float)local_980._0_4_;
          fStack_33c = (float)local_800._4_4_ + (float)local_980._4_4_;
          fStack_338 = fStack_7f8 + fStack_978;
          fStack_334 = fStack_7f4 + fStack_974;
          fStack_330 = fStack_7f0 + fStack_970;
          fStack_32c = fStack_7ec + fStack_96c;
          fStack_328 = fStack_7e8 + fStack_968;
          fStack_324 = fStack_7e4 + fStack_964;
          do {
            auVar143._8_4_ = 0x7f800000;
            auVar143._0_8_ = 0x7f8000007f800000;
            auVar143._12_4_ = 0x7f800000;
            auVar143._16_4_ = 0x7f800000;
            auVar143._20_4_ = 0x7f800000;
            auVar143._24_4_ = 0x7f800000;
            auVar143._28_4_ = 0x7f800000;
            auVar84 = vblendmps_avx512vl(auVar143,_local_800);
            auVar118._0_4_ =
                 (uint)(bVar61 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar61 & 1) * 0x7f800000;
            bVar65 = (bool)(bVar61 >> 1 & 1);
            auVar118._4_4_ = (uint)bVar65 * auVar84._4_4_ | (uint)!bVar65 * 0x7f800000;
            bVar65 = (bool)(bVar61 >> 2 & 1);
            auVar118._8_4_ = (uint)bVar65 * auVar84._8_4_ | (uint)!bVar65 * 0x7f800000;
            bVar65 = (bool)(bVar61 >> 3 & 1);
            auVar118._12_4_ = (uint)bVar65 * auVar84._12_4_ | (uint)!bVar65 * 0x7f800000;
            bVar65 = (bool)(bVar61 >> 4 & 1);
            auVar118._16_4_ = (uint)bVar65 * auVar84._16_4_ | (uint)!bVar65 * 0x7f800000;
            bVar65 = (bool)(bVar61 >> 5 & 1);
            auVar118._20_4_ = (uint)bVar65 * auVar84._20_4_ | (uint)!bVar65 * 0x7f800000;
            auVar118._24_4_ =
                 (uint)(bVar61 >> 6) * auVar84._24_4_ | (uint)!(bool)(bVar61 >> 6) * 0x7f800000;
            auVar118._28_4_ = 0x7f800000;
            auVar84 = vshufps_avx(auVar118,auVar118,0xb1);
            auVar84 = vminps_avx(auVar118,auVar84);
            auVar86 = vshufpd_avx(auVar84,auVar84,5);
            auVar84 = vminps_avx(auVar84,auVar86);
            auVar86 = vpermpd_avx2(auVar84,0x4e);
            auVar84 = vminps_avx(auVar84,auVar86);
            uVar15 = vcmpps_avx512vl(auVar118,auVar84,0);
            bVar57 = (byte)uVar15 & bVar61;
            bVar58 = bVar61;
            if (bVar57 != 0) {
              bVar58 = bVar57;
            }
            iVar19 = 0;
            for (uVar70 = (uint)bVar58; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x80000000) {
              iVar19 = iVar19 + 1;
            }
            auVar221 = ZEXT464(*(uint *)(local_1e0 + (uint)(iVar19 << 2)));
            fVar169 = local_988;
            fVar167 = *(float *)(local_1c0 + (uint)(iVar19 << 2));
            uVar149 = 0;
            uVar248 = 0;
            uVar249 = 0;
            if ((float)local_6a0._0_4_ < 0.0) {
              local_760._0_16_ = ZEXT416(*(uint *)(local_1e0 + (uint)(iVar19 << 2)));
              local_780._0_16_ = ZEXT416((uint)*(float *)(local_1c0 + (uint)(iVar19 << 2)));
              fVar169 = sqrtf((float)local_6a0._0_4_);
              auVar221 = ZEXT1664(local_760._0_16_);
              fVar167 = (float)local_780._0_4_;
              uVar149 = local_780._4_4_;
              uVar248 = local_780._8_4_;
              uVar249 = local_780._12_4_;
            }
            bVar65 = true;
            uVar67 = 0;
            do {
              auVar84 = local_780;
              auVar133._4_4_ = fVar167;
              auVar133._0_4_ = fVar167;
              auVar133._8_4_ = fVar167;
              auVar133._12_4_ = fVar167;
              auVar74 = vfmadd132ps_fma(auVar133,ZEXT816(0) << 0x40,local_690);
              fVar166 = auVar221._0_4_;
              fVar147 = 1.0 - fVar166;
              auVar182._0_4_ = local_5a0._0_4_ * fVar166;
              auVar182._4_4_ = local_5a0._4_4_ * fVar166;
              auVar182._8_4_ = local_5a0._8_4_ * fVar166;
              auVar182._12_4_ = local_5a0._12_4_ * fVar166;
              local_4e0._0_16_ = ZEXT416((uint)fVar147);
              auVar207._4_4_ = fVar147;
              auVar207._0_4_ = fVar147;
              auVar207._8_4_ = fVar147;
              auVar207._12_4_ = fVar147;
              auVar75 = vfmadd231ps_fma(auVar182,auVar207,local_560._0_16_);
              auVar213._0_4_ = local_580._0_4_ * fVar166;
              auVar213._4_4_ = local_580._4_4_ * fVar166;
              auVar213._8_4_ = local_580._8_4_ * fVar166;
              auVar213._12_4_ = local_580._12_4_ * fVar166;
              auVar77 = vfmadd231ps_fma(auVar213,auVar207,local_5a0._0_16_);
              auVar227._0_4_ = fVar166 * (float)local_5c0._0_4_;
              auVar227._4_4_ = fVar166 * (float)local_5c0._4_4_;
              auVar227._8_4_ = fVar166 * fStack_5b8;
              auVar227._12_4_ = fVar166 * fStack_5b4;
              auVar78 = vfmadd231ps_fma(auVar227,auVar207,local_580._0_16_);
              auVar236._0_4_ = fVar166 * auVar77._0_4_;
              auVar236._4_4_ = fVar166 * auVar77._4_4_;
              auVar236._8_4_ = fVar166 * auVar77._8_4_;
              auVar236._12_4_ = fVar166 * auVar77._12_4_;
              auVar75 = vfmadd231ps_fma(auVar236,auVar207,auVar75);
              auVar183._0_4_ = fVar166 * auVar78._0_4_;
              auVar183._4_4_ = fVar166 * auVar78._4_4_;
              auVar183._8_4_ = fVar166 * auVar78._8_4_;
              auVar183._12_4_ = fVar166 * auVar78._12_4_;
              auVar77 = vfmadd231ps_fma(auVar183,auVar207,auVar77);
              auVar214._0_4_ = fVar166 * auVar77._0_4_;
              auVar214._4_4_ = fVar166 * auVar77._4_4_;
              auVar214._8_4_ = fVar166 * auVar77._8_4_;
              auVar214._12_4_ = fVar166 * auVar77._12_4_;
              auVar78 = vfmadd231ps_fma(auVar214,auVar75,auVar207);
              auVar75 = vsubps_avx(auVar77,auVar75);
              auVar27._8_4_ = 0x40400000;
              auVar27._0_8_ = 0x4040000040400000;
              auVar27._12_4_ = 0x40400000;
              auVar77 = vmulps_avx512vl(auVar75,auVar27);
              _local_4c0 = auVar78;
              auVar75 = vsubps_avx(auVar74,auVar78);
              local_6c0._0_16_ = auVar75;
              auVar75 = vdpps_avx(auVar75,auVar75,0x7f);
              local_660._0_16_ = auVar75;
              local_760._0_16_ = auVar221._0_16_;
              local_780._4_4_ = uVar149;
              local_780._0_4_ = fVar167;
              local_780._8_4_ = uVar248;
              local_780._16_16_ = auVar84._16_16_;
              local_780._12_4_ = uVar249;
              if (auVar75._0_4_ < 0.0) {
                auVar246._0_4_ = sqrtf(auVar75._0_4_);
                auVar246._4_60_ = extraout_var;
                auVar75 = auVar246._0_16_;
              }
              else {
                auVar75 = vsqrtss_avx(auVar75,auVar75);
              }
              local_500._0_16_ = vdpps_avx(auVar77,auVar77,0x7f);
              fVar147 = local_500._0_4_;
              auVar184._4_12_ = ZEXT812(0) << 0x20;
              auVar184._0_4_ = fVar147;
              local_6e0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar184);
              fVar166 = local_6e0._0_4_;
              local_520._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar184);
              auVar28._8_4_ = 0x80000000;
              auVar28._0_8_ = 0x8000000080000000;
              auVar28._12_4_ = 0x80000000;
              auVar78 = vxorps_avx512vl(local_500._0_16_,auVar28);
              auVar74 = vfnmadd213ss_fma(local_520._0_16_,local_500._0_16_,ZEXT416(0x40000000));
              local_540._0_4_ = auVar74._0_4_;
              local_680._0_4_ = auVar75._0_4_;
              if (fVar147 < auVar78._0_4_) {
                auVar251._0_4_ = sqrtf(fVar147);
                auVar251._4_60_ = extraout_var_00;
                auVar75 = ZEXT416((uint)local_680._0_4_);
                auVar74 = auVar251._0_16_;
              }
              else {
                auVar74 = vsqrtss_avx512f(local_500._0_16_,local_500._0_16_);
              }
              fVar168 = local_6e0._0_4_;
              fVar147 = fVar166 * 1.5 + fVar147 * -0.5 * fVar168 * fVar168 * fVar168;
              auVar134._0_4_ = auVar77._0_4_ * fVar147;
              auVar134._4_4_ = auVar77._4_4_ * fVar147;
              auVar134._8_4_ = auVar77._8_4_ * fVar147;
              auVar134._12_4_ = auVar77._12_4_ * fVar147;
              local_6e0._0_16_ = vdpps_avx(local_6c0._0_16_,auVar134,0x7f);
              auVar79 = vaddss_avx512f(auVar75,ZEXT416(0x3f800000));
              auVar135._0_4_ = local_6e0._0_4_ * local_6e0._0_4_;
              auVar135._4_4_ = local_6e0._4_4_ * local_6e0._4_4_;
              auVar135._8_4_ = local_6e0._8_4_ * local_6e0._8_4_;
              auVar135._12_4_ = local_6e0._12_4_ * local_6e0._12_4_;
              auVar78 = vsubps_avx(local_660._0_16_,auVar135);
              fVar166 = auVar78._0_4_;
              auVar154._4_12_ = ZEXT812(0) << 0x20;
              auVar154._0_4_ = fVar166;
              auVar80 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar154);
              auVar81 = vmulss_avx512f(auVar80,ZEXT416(0x3fc00000));
              auVar76 = vmulss_avx512f(auVar78,ZEXT416(0xbf000000));
              uVar66 = fVar166 == 0.0;
              uVar64 = fVar166 < 0.0;
              if ((bool)uVar64) {
                local_600._0_4_ = auVar81._0_4_;
                local_620 = fVar147;
                fStack_61c = fVar147;
                fStack_618 = fVar147;
                fStack_614 = fVar147;
                local_610 = auVar80;
                fVar171 = sqrtf(fVar166);
                auVar76 = ZEXT416(auVar76._0_4_);
                auVar81 = ZEXT416((uint)local_600._0_4_);
                auVar74 = ZEXT416(auVar74._0_4_);
                auVar75 = ZEXT416((uint)local_680._0_4_);
                auVar79 = ZEXT416(auVar79._0_4_);
                auVar80 = local_610;
                fVar147 = local_620;
                fVar166 = fStack_61c;
                fVar168 = fStack_618;
                fVar170 = fStack_614;
              }
              else {
                auVar78 = vsqrtss_avx(auVar78,auVar78);
                fVar171 = auVar78._0_4_;
                fVar166 = fVar147;
                fVar168 = fVar147;
                fVar170 = fVar147;
              }
              auVar266 = ZEXT3264(local_700);
              auVar246 = ZEXT3264(local_820);
              auVar251 = ZEXT3264(local_840);
              auVar265 = ZEXT3264(local_880);
              auVar254 = ZEXT3264(local_8a0);
              auVar255 = ZEXT3264(local_8c0);
              auVar256 = ZEXT3264(local_8e0);
              auVar257 = ZEXT3264(local_900);
              auVar258 = ZEXT3264(local_7a0);
              auVar259 = ZEXT3264(local_920);
              auVar260 = ZEXT3264(local_7c0);
              auVar261 = ZEXT3264(local_940);
              auVar262 = ZEXT3264(local_960);
              auVar263 = ZEXT3264(local_7e0);
              auVar78 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_760._0_16_,
                                        local_4e0._0_16_);
              fVar146 = auVar78._0_4_ * 6.0;
              fVar172 = local_760._0_4_ * 6.0;
              auVar185._0_4_ = fVar172 * (float)local_5c0._0_4_;
              auVar185._4_4_ = fVar172 * (float)local_5c0._4_4_;
              auVar185._8_4_ = fVar172 * fStack_5b8;
              auVar185._12_4_ = fVar172 * fStack_5b4;
              auVar155._4_4_ = fVar146;
              auVar155._0_4_ = fVar146;
              auVar155._8_4_ = fVar146;
              auVar155._12_4_ = fVar146;
              auVar78 = vfmadd132ps_fma(auVar155,auVar185,local_580._0_16_);
              auVar264 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_4e0._0_16_,
                                         local_760._0_16_);
              fVar146 = auVar264._0_4_ * 6.0;
              auVar186._4_4_ = fVar146;
              auVar186._0_4_ = fVar146;
              auVar186._8_4_ = fVar146;
              auVar186._12_4_ = fVar146;
              auVar78 = vfmadd132ps_fma(auVar186,auVar78,local_5a0._0_16_);
              fVar146 = local_4e0._0_4_ * 6.0;
              auVar156._4_4_ = fVar146;
              auVar156._0_4_ = fVar146;
              auVar156._8_4_ = fVar146;
              auVar156._12_4_ = fVar146;
              auVar78 = vfmadd132ps_fma(auVar156,auVar78,local_560._0_16_);
              auVar187._0_4_ = auVar78._0_4_ * (float)local_500._0_4_;
              auVar187._4_4_ = auVar78._4_4_ * (float)local_500._0_4_;
              auVar187._8_4_ = auVar78._8_4_ * (float)local_500._0_4_;
              auVar187._12_4_ = auVar78._12_4_ * (float)local_500._0_4_;
              auVar78 = vdpps_avx(auVar77,auVar78,0x7f);
              fVar146 = auVar78._0_4_;
              auVar157._0_4_ = auVar77._0_4_ * fVar146;
              auVar157._4_4_ = auVar77._4_4_ * fVar146;
              auVar157._8_4_ = auVar77._8_4_ * fVar146;
              auVar157._12_4_ = auVar77._12_4_ * fVar146;
              auVar78 = vsubps_avx(auVar187,auVar157);
              fVar146 = (float)local_540._0_4_ * (float)local_520._0_4_;
              auVar29._8_4_ = 0x80000000;
              auVar29._0_8_ = 0x8000000080000000;
              auVar29._12_4_ = 0x80000000;
              auVar82 = vxorps_avx512vl(auVar77,auVar29);
              auVar215._0_4_ = fVar147 * auVar78._0_4_ * fVar146;
              auVar215._4_4_ = fVar166 * auVar78._4_4_ * fVar146;
              auVar215._8_4_ = fVar168 * auVar78._8_4_ * fVar146;
              auVar215._12_4_ = fVar170 * auVar78._12_4_ * fVar146;
              auVar78 = vdpps_avx(auVar82,auVar134,0x7f);
              auVar264 = vmaxss_avx(ZEXT416((uint)fVar148),
                                    ZEXT416((uint)((float)local_780._0_4_ * fVar169 * 1.9073486e-06)
                                           ));
              auVar83 = vdivss_avx512f(ZEXT416((uint)fVar148),auVar74);
              auVar74 = vdpps_avx(local_6c0._0_16_,auVar215,0x7f);
              auVar75 = vfmadd213ss_fma(auVar75,ZEXT416((uint)fVar148),auVar264);
              vfmadd213ss_avx512f(auVar79,auVar83,auVar75);
              auVar75 = vdpps_avx(local_690,auVar134,0x7f);
              fVar147 = auVar78._0_4_ + auVar74._0_4_;
              auVar74 = vdpps_avx(local_6c0._0_16_,auVar82,0x7f);
              auVar79 = vmulss_avx512f(auVar76,auVar80);
              auVar80 = vmulss_avx512f(auVar80,auVar80);
              auVar78 = vdpps_avx(local_6c0._0_16_,local_690,0x7f);
              auVar80 = vaddss_avx512f(auVar81,ZEXT416((uint)(auVar79._0_4_ * auVar80._0_4_)));
              auVar79 = vfnmadd231ss_avx512f(auVar74,local_6e0._0_16_,ZEXT416((uint)fVar147));
              auVar81 = vfnmadd231ss_avx512f(auVar78,local_6e0._0_16_,auVar75);
              auVar74 = vpermilps_avx(_local_4c0,0xff);
              fVar171 = fVar171 - auVar74._0_4_;
              auVar74 = vshufps_avx(auVar77,auVar77,0xff);
              auVar78 = vfmsub213ss_fma(auVar79,auVar80,auVar74);
              fVar166 = auVar81._0_4_ * auVar80._0_4_;
              auVar80 = vfmsub231ss_fma(ZEXT416((uint)(auVar75._0_4_ * auVar78._0_4_)),
                                        ZEXT416((uint)fVar147),ZEXT416((uint)fVar166));
              fVar168 = auVar80._0_4_;
              auVar237._0_4_ = fVar166 / fVar168;
              auVar237._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar228._0_4_ = auVar78._0_4_ / fVar168;
              auVar228._4_12_ = auVar78._4_12_;
              auVar78 = vmulss_avx512f(local_6e0._0_16_,auVar237);
              auVar80 = vmulss_avx512f(local_6e0._0_16_,auVar228);
              fVar173 = local_760._0_4_ - (auVar78._0_4_ - fVar171 * (auVar75._0_4_ / fVar168));
              auVar221 = ZEXT464((uint)fVar173);
              fVar167 = (float)local_780._0_4_ - (fVar171 * (fVar147 / fVar168) - auVar80._0_4_);
              uVar149 = 0;
              uVar248 = 0;
              uVar249 = 0;
              auVar30._8_4_ = 0x7fffffff;
              auVar30._0_8_ = 0x7fffffff7fffffff;
              auVar30._12_4_ = 0x7fffffff;
              auVar75 = vandps_avx512vl(local_6e0._0_16_,auVar30);
              auVar75 = vucomiss_avx512f(auVar75);
              fVar147 = (float)local_980._0_4_;
              fVar166 = (float)local_980._4_4_;
              fVar168 = fStack_978;
              fVar170 = fStack_974;
              fVar146 = fStack_970;
              fVar172 = fStack_96c;
              fVar174 = fStack_968;
              fVar176 = fStack_964;
              if (!(bool)uVar64 && !(bool)uVar66) {
                auVar75 = vaddss_avx512f(auVar264,auVar75);
                auVar75 = vfmadd231ss_fma(auVar75,local_630,ZEXT416(0x36000000));
                auVar31._8_4_ = 0x7fffffff;
                auVar31._0_8_ = 0x7fffffff7fffffff;
                auVar31._12_4_ = 0x7fffffff;
                auVar78 = vandps_avx512vl(ZEXT416((uint)fVar171),auVar31);
                if (auVar78._0_4_ < auVar75._0_4_) {
                  fVar167 = fVar167 + (float)local_640._0_4_;
                  auVar241 = ZEXT3264(local_860);
                  if (fVar128 <= fVar167) {
                    fVar169 = *(float *)(ray + k * 4 + 0x80);
                    bVar58 = 0;
                    if (((fVar169 < fVar167) || (fVar173 < 0.0)) || (bVar58 = 0, 1.0 < fVar173))
                    goto LAB_01b6aad5;
                    auVar188._4_12_ = SUB1612(ZEXT816(0),0);
                    auVar188._0_4_ = local_660._0_4_;
                    auVar75 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar188);
                    fVar171 = auVar75._0_4_;
                    pGVar3 = (context->scene->geometries).items[local_738].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar58 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_01b6aad5;
                      fVar171 = fVar171 * 1.5 +
                                (float)local_660._0_4_ * -0.5 * fVar171 * fVar171 * fVar171;
                      auVar189._0_4_ = local_6c0._0_4_ * fVar171;
                      auVar189._4_4_ = local_6c0._4_4_ * fVar171;
                      auVar189._8_4_ = local_6c0._8_4_ * fVar171;
                      auVar189._12_4_ = local_6c0._12_4_ * fVar171;
                      auVar78 = vfmadd213ps_fma(auVar74,auVar189,auVar77);
                      auVar75 = vshufps_avx(auVar189,auVar189,0xc9);
                      auVar74 = vshufps_avx(auVar77,auVar77,0xc9);
                      auVar190._0_4_ = auVar189._0_4_ * auVar74._0_4_;
                      auVar190._4_4_ = auVar189._4_4_ * auVar74._4_4_;
                      auVar190._8_4_ = auVar189._8_4_ * auVar74._8_4_;
                      auVar190._12_4_ = auVar189._12_4_ * auVar74._12_4_;
                      auVar77 = vfmsub231ps_fma(auVar190,auVar77,auVar75);
                      auVar75 = vshufps_avx(auVar77,auVar77,0xc9);
                      auVar74 = vshufps_avx(auVar78,auVar78,0xc9);
                      auVar77 = vshufps_avx(auVar77,auVar77,0xd2);
                      auVar136._0_4_ = auVar78._0_4_ * auVar77._0_4_;
                      auVar136._4_4_ = auVar78._4_4_ * auVar77._4_4_;
                      auVar136._8_4_ = auVar78._8_4_ * auVar77._8_4_;
                      auVar136._12_4_ = auVar78._12_4_ * auVar77._12_4_;
                      auVar75 = vfmsub231ps_fma(auVar136,auVar75,auVar74);
                      local_460 = (RTCHitN  [16])vshufps_avx(auVar75,auVar75,0x55);
                      auStack_450 = vshufps_avx(auVar75,auVar75,0xaa);
                      local_440 = auVar75._0_4_;
                      uStack_43c = local_440;
                      uStack_438 = local_440;
                      uStack_434 = local_440;
                      local_430 = fVar173;
                      fStack_42c = fVar173;
                      fStack_428 = fVar173;
                      fStack_424 = fVar173;
                      local_420 = ZEXT416(0) << 0x20;
                      local_410 = local_470._0_8_;
                      uStack_408 = local_470._8_8_;
                      local_400 = local_480;
                      vpcmpeqd_avx2(ZEXT1632(local_480),ZEXT1632(local_480));
                      uStack_3ec = context->user->instID[0];
                      local_3f0 = uStack_3ec;
                      uStack_3e8 = uStack_3ec;
                      uStack_3e4 = uStack_3ec;
                      uStack_3e0 = context->user->instPrimID[0];
                      uStack_3dc = uStack_3e0;
                      uStack_3d8 = uStack_3e0;
                      uStack_3d4 = uStack_3e0;
                      *(float *)(ray + k * 4 + 0x80) = fVar167;
                      local_9a0 = local_490;
                      local_730.valid = (int *)local_9a0;
                      local_730.geometryUserPtr = pGVar3->userPtr;
                      local_730.context = context->user;
                      local_730.hit = local_460;
                      local_730.N = 4;
                      local_730.ray = (RTCRayN *)ray;
                      if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar3->occlusionFilterN)(&local_730);
                        auVar263 = ZEXT3264(local_7e0);
                        auVar262 = ZEXT3264(local_960);
                        auVar261 = ZEXT3264(local_940);
                        auVar260 = ZEXT3264(local_7c0);
                        auVar259 = ZEXT3264(local_920);
                        auVar258 = ZEXT3264(local_7a0);
                        auVar257 = ZEXT3264(local_900);
                        auVar256 = ZEXT3264(local_8e0);
                        auVar255 = ZEXT3264(local_8c0);
                        auVar254 = ZEXT3264(local_8a0);
                        auVar241 = ZEXT3264(local_860);
                        auVar265 = ZEXT3264(local_880);
                        auVar251 = ZEXT3264(local_840);
                        auVar246 = ZEXT3264(local_820);
                        auVar266 = ZEXT3264(local_700);
                        fVar147 = (float)local_980._0_4_;
                        fVar166 = (float)local_980._4_4_;
                        fVar168 = fStack_978;
                        fVar170 = fStack_974;
                        fVar146 = fStack_970;
                        fVar172 = fStack_96c;
                        fVar174 = fStack_968;
                        fVar176 = fStack_964;
                      }
                      uVar67 = vptestmd_avx512vl(local_9a0,local_9a0);
                      if ((uVar67 & 0xf) != 0) {
                        p_Var7 = context->args->filter;
                        if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var7)(&local_730);
                          auVar263 = ZEXT3264(local_7e0);
                          auVar262 = ZEXT3264(local_960);
                          auVar261 = ZEXT3264(local_940);
                          auVar260 = ZEXT3264(local_7c0);
                          auVar259 = ZEXT3264(local_920);
                          auVar258 = ZEXT3264(local_7a0);
                          auVar257 = ZEXT3264(local_900);
                          auVar256 = ZEXT3264(local_8e0);
                          auVar255 = ZEXT3264(local_8c0);
                          auVar254 = ZEXT3264(local_8a0);
                          auVar241 = ZEXT3264(local_860);
                          auVar265 = ZEXT3264(local_880);
                          auVar251 = ZEXT3264(local_840);
                          auVar246 = ZEXT3264(local_820);
                          auVar266 = ZEXT3264(local_700);
                          fVar147 = (float)local_980._0_4_;
                          fVar166 = (float)local_980._4_4_;
                          fVar168 = fStack_978;
                          fVar170 = fStack_974;
                          fVar146 = fStack_970;
                          fVar172 = fStack_96c;
                          fVar174 = fStack_968;
                          fVar176 = fStack_964;
                        }
                        uVar67 = vptestmd_avx512vl(local_9a0,local_9a0);
                        uVar67 = uVar67 & 0xf;
                        auVar75 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar8 = (bool)((byte)uVar67 & 1);
                        bVar9 = (bool)((byte)(uVar67 >> 1) & 1);
                        bVar10 = (bool)((byte)(uVar67 >> 2) & 1);
                        bVar11 = SUB81(uVar67 >> 3,0);
                        *(uint *)(local_730.ray + 0x80) =
                             (uint)bVar8 * auVar75._0_4_ |
                             (uint)!bVar8 * *(int *)(local_730.ray + 0x80);
                        *(uint *)(local_730.ray + 0x84) =
                             (uint)bVar9 * auVar75._4_4_ |
                             (uint)!bVar9 * *(int *)(local_730.ray + 0x84);
                        *(uint *)(local_730.ray + 0x88) =
                             (uint)bVar10 * auVar75._8_4_ |
                             (uint)!bVar10 * *(int *)(local_730.ray + 0x88);
                        *(uint *)(local_730.ray + 0x8c) =
                             (uint)bVar11 * auVar75._12_4_ |
                             (uint)!bVar11 * *(int *)(local_730.ray + 0x8c);
                        bVar58 = 1;
                        if ((byte)uVar67 != 0) goto LAB_01b6aad5;
                      }
                      *(float *)(ray + k * 4 + 0x80) = fVar169;
                      bVar58 = 0;
                      goto LAB_01b6aad5;
                    }
                  }
                  bVar58 = 0;
                  goto LAB_01b6aad5;
                }
              }
              bVar65 = uVar67 < 4;
              uVar67 = uVar67 + 1;
            } while (uVar67 != 5);
            bVar65 = false;
            auVar241 = ZEXT3264(local_860);
            bVar58 = 5;
LAB_01b6aad5:
            bVar62 = (bool)(bVar62 | bVar65 & bVar58);
            uVar149 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar144._4_4_ = uVar149;
            auVar144._0_4_ = uVar149;
            auVar144._8_4_ = uVar149;
            auVar144._12_4_ = uVar149;
            auVar144._16_4_ = uVar149;
            auVar144._20_4_ = uVar149;
            auVar144._24_4_ = uVar149;
            auVar144._28_4_ = uVar149;
            auVar53._4_4_ = fStack_33c;
            auVar53._0_4_ = local_340;
            auVar53._8_4_ = fStack_338;
            auVar53._12_4_ = fStack_334;
            auVar53._16_4_ = fStack_330;
            auVar53._20_4_ = fStack_32c;
            auVar53._24_4_ = fStack_328;
            auVar53._28_4_ = fStack_324;
            uVar15 = vcmpps_avx512vl(auVar144,auVar53,0xd);
            bVar61 = ~('\x01' << ((byte)iVar19 & 0x1f)) & bVar61 & (byte)uVar15;
          } while (bVar61 != 0);
          uVar68 = (ulong)local_990;
          auVar84 = local_2a0;
        }
        bVar61 = local_360[0] | (byte)uVar68;
        auVar164._0_4_ = fVar147 + auVar84._0_4_;
        auVar164._4_4_ = fVar166 + auVar84._4_4_;
        auVar164._8_4_ = fVar168 + auVar84._8_4_;
        auVar164._12_4_ = fVar170 + auVar84._12_4_;
        auVar164._16_4_ = fVar146 + auVar84._16_4_;
        auVar164._20_4_ = fVar172 + auVar84._20_4_;
        auVar164._24_4_ = fVar174 + auVar84._24_4_;
        auVar164._28_4_ = fVar176 + auVar84._28_4_;
        uVar15 = vcmpps_avx512vl(auVar164,auVar144,2);
        bVar56 = (byte)uVar16 & bVar56 & (byte)uVar15;
        auVar165._8_4_ = 2;
        auVar165._0_8_ = 0x200000002;
        auVar165._12_4_ = 2;
        auVar165._16_4_ = 2;
        auVar165._20_4_ = 2;
        auVar165._24_4_ = 2;
        auVar165._28_4_ = 2;
        auVar39._8_4_ = 3;
        auVar39._0_8_ = 0x300000003;
        auVar39._12_4_ = 3;
        auVar39._16_4_ = 3;
        auVar39._20_4_ = 3;
        auVar39._24_4_ = 3;
        auVar39._28_4_ = 3;
        auVar84 = vpblendmd_avx512vl(auVar165,auVar39);
        auVar119._0_4_ = (uint)(bVar61 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar61 & 1) * 2;
        bVar65 = (bool)(bVar61 >> 1 & 1);
        auVar119._4_4_ = (uint)bVar65 * auVar84._4_4_ | (uint)!bVar65 * 2;
        bVar65 = (bool)(bVar61 >> 2 & 1);
        auVar119._8_4_ = (uint)bVar65 * auVar84._8_4_ | (uint)!bVar65 * 2;
        bVar65 = (bool)(bVar61 >> 3 & 1);
        auVar119._12_4_ = (uint)bVar65 * auVar84._12_4_ | (uint)!bVar65 * 2;
        bVar65 = (bool)(bVar61 >> 4 & 1);
        auVar119._16_4_ = (uint)bVar65 * auVar84._16_4_ | (uint)!bVar65 * 2;
        bVar65 = (bool)(bVar61 >> 5 & 1);
        auVar119._20_4_ = (uint)bVar65 * auVar84._20_4_ | (uint)!bVar65 * 2;
        bVar65 = (bool)(bVar61 >> 6 & 1);
        auVar119._24_4_ = (uint)bVar65 * auVar84._24_4_ | (uint)!bVar65 * 2;
        auVar119._28_4_ = (uint)(bVar61 >> 7) * auVar84._28_4_ | (uint)!(bool)(bVar61 >> 7) * 2;
        uVar15 = vpcmpd_avx512vl(local_300,auVar119,5);
        bVar61 = (byte)uVar15 & bVar56;
        if (bVar61 != 0) {
          local_360 = auVar119;
          auVar74 = vminps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar75 = vmaxps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar77 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar78 = vminps_avx(auVar74,auVar77);
          auVar74 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar221 = ZEXT3264(local_2e0);
          auVar77 = vmaxps_avx(auVar75,auVar74);
          auVar191._8_4_ = 0x7fffffff;
          auVar191._0_8_ = 0x7fffffff7fffffff;
          auVar191._12_4_ = 0x7fffffff;
          auVar75 = vandps_avx(auVar78,auVar191);
          auVar74 = vandps_avx(auVar77,auVar191);
          auVar75 = vmaxps_avx(auVar75,auVar74);
          auVar74 = vmovshdup_avx(auVar75);
          auVar74 = vmaxss_avx(auVar74,auVar75);
          auVar75 = vshufpd_avx(auVar75,auVar75,1);
          auVar75 = vmaxss_avx(auVar75,auVar74);
          fVar148 = auVar75._0_4_ * 1.9073486e-06;
          local_630 = vshufps_avx(auVar77,auVar77,0xff);
          local_340 = fVar147 + local_2e0._0_4_;
          fStack_33c = fVar166 + local_2e0._4_4_;
          fStack_338 = fVar168 + local_2e0._8_4_;
          fStack_334 = fVar170 + local_2e0._12_4_;
          fStack_330 = fVar146 + local_2e0._16_4_;
          fStack_32c = fVar172 + local_2e0._20_4_;
          fStack_328 = fVar174 + local_2e0._24_4_;
          fStack_324 = fVar176 + local_2e0._28_4_;
          _local_800 = local_2e0;
          do {
            auVar145._8_4_ = 0x7f800000;
            auVar145._0_8_ = 0x7f8000007f800000;
            auVar145._12_4_ = 0x7f800000;
            auVar145._16_4_ = 0x7f800000;
            auVar145._20_4_ = 0x7f800000;
            auVar145._24_4_ = 0x7f800000;
            auVar145._28_4_ = 0x7f800000;
            auVar84 = vblendmps_avx512vl(auVar145,auVar221._0_32_);
            auVar120._0_4_ =
                 (uint)(bVar61 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar61 & 1) * 0x7f800000;
            bVar65 = (bool)(bVar61 >> 1 & 1);
            auVar120._4_4_ = (uint)bVar65 * auVar84._4_4_ | (uint)!bVar65 * 0x7f800000;
            bVar65 = (bool)(bVar61 >> 2 & 1);
            auVar120._8_4_ = (uint)bVar65 * auVar84._8_4_ | (uint)!bVar65 * 0x7f800000;
            bVar65 = (bool)(bVar61 >> 3 & 1);
            auVar120._12_4_ = (uint)bVar65 * auVar84._12_4_ | (uint)!bVar65 * 0x7f800000;
            bVar65 = (bool)(bVar61 >> 4 & 1);
            auVar120._16_4_ = (uint)bVar65 * auVar84._16_4_ | (uint)!bVar65 * 0x7f800000;
            bVar65 = (bool)(bVar61 >> 5 & 1);
            auVar120._20_4_ = (uint)bVar65 * auVar84._20_4_ | (uint)!bVar65 * 0x7f800000;
            auVar120._24_4_ =
                 (uint)(bVar61 >> 6) * auVar84._24_4_ | (uint)!(bool)(bVar61 >> 6) * 0x7f800000;
            auVar120._28_4_ = 0x7f800000;
            auVar84 = vshufps_avx(auVar120,auVar120,0xb1);
            auVar84 = vminps_avx(auVar120,auVar84);
            auVar86 = vshufpd_avx(auVar84,auVar84,5);
            auVar84 = vminps_avx(auVar84,auVar86);
            auVar86 = vpermpd_avx2(auVar84,0x4e);
            auVar84 = vminps_avx(auVar84,auVar86);
            uVar15 = vcmpps_avx512vl(auVar120,auVar84,0);
            bVar57 = (byte)uVar15 & bVar61;
            bVar58 = bVar61;
            if (bVar57 != 0) {
              bVar58 = bVar57;
            }
            iVar19 = 0;
            for (uVar70 = (uint)bVar58; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x80000000) {
              iVar19 = iVar19 + 1;
            }
            auVar221 = ZEXT464(*(uint *)(local_200 + (uint)(iVar19 << 2)));
            fVar169 = local_984;
            fVar167 = *(float *)(local_2c0 + (uint)(iVar19 << 2));
            uVar149 = 0;
            uVar248 = 0;
            uVar249 = 0;
            if ((float)local_6a0._0_4_ < 0.0) {
              local_760._0_16_ = ZEXT416(*(uint *)(local_200 + (uint)(iVar19 << 2)));
              local_780._0_16_ = ZEXT416((uint)*(float *)(local_2c0 + (uint)(iVar19 << 2)));
              fVar169 = sqrtf((float)local_6a0._0_4_);
              auVar221 = ZEXT1664(local_760._0_16_);
              fVar167 = (float)local_780._0_4_;
              uVar149 = local_780._4_4_;
              uVar248 = local_780._8_4_;
              uVar249 = local_780._12_4_;
            }
            bVar65 = true;
            uVar67 = 0;
            do {
              auVar84 = local_780;
              auVar137._4_4_ = fVar167;
              auVar137._0_4_ = fVar167;
              auVar137._8_4_ = fVar167;
              auVar137._12_4_ = fVar167;
              auVar74 = vfmadd132ps_fma(auVar137,ZEXT816(0) << 0x40,local_690);
              fVar166 = auVar221._0_4_;
              fVar147 = 1.0 - fVar166;
              auVar192._0_4_ = local_5a0._0_4_ * fVar166;
              auVar192._4_4_ = local_5a0._4_4_ * fVar166;
              auVar192._8_4_ = local_5a0._8_4_ * fVar166;
              auVar192._12_4_ = local_5a0._12_4_ * fVar166;
              local_4e0._0_16_ = ZEXT416((uint)fVar147);
              auVar208._4_4_ = fVar147;
              auVar208._0_4_ = fVar147;
              auVar208._8_4_ = fVar147;
              auVar208._12_4_ = fVar147;
              auVar75 = vfmadd231ps_fma(auVar192,auVar208,local_560._0_16_);
              auVar216._0_4_ = local_580._0_4_ * fVar166;
              auVar216._4_4_ = local_580._4_4_ * fVar166;
              auVar216._8_4_ = local_580._8_4_ * fVar166;
              auVar216._12_4_ = local_580._12_4_ * fVar166;
              auVar77 = vfmadd231ps_fma(auVar216,auVar208,local_5a0._0_16_);
              auVar229._0_4_ = fVar166 * (float)local_5c0._0_4_;
              auVar229._4_4_ = fVar166 * (float)local_5c0._4_4_;
              auVar229._8_4_ = fVar166 * fStack_5b8;
              auVar229._12_4_ = fVar166 * fStack_5b4;
              auVar78 = vfmadd231ps_fma(auVar229,auVar208,local_580._0_16_);
              auVar238._0_4_ = fVar166 * auVar77._0_4_;
              auVar238._4_4_ = fVar166 * auVar77._4_4_;
              auVar238._8_4_ = fVar166 * auVar77._8_4_;
              auVar238._12_4_ = fVar166 * auVar77._12_4_;
              auVar75 = vfmadd231ps_fma(auVar238,auVar208,auVar75);
              auVar193._0_4_ = fVar166 * auVar78._0_4_;
              auVar193._4_4_ = fVar166 * auVar78._4_4_;
              auVar193._8_4_ = fVar166 * auVar78._8_4_;
              auVar193._12_4_ = fVar166 * auVar78._12_4_;
              auVar77 = vfmadd231ps_fma(auVar193,auVar208,auVar77);
              auVar217._0_4_ = fVar166 * auVar77._0_4_;
              auVar217._4_4_ = fVar166 * auVar77._4_4_;
              auVar217._8_4_ = fVar166 * auVar77._8_4_;
              auVar217._12_4_ = fVar166 * auVar77._12_4_;
              auVar78 = vfmadd231ps_fma(auVar217,auVar75,auVar208);
              auVar75 = vsubps_avx(auVar77,auVar75);
              auVar32._8_4_ = 0x40400000;
              auVar32._0_8_ = 0x4040000040400000;
              auVar32._12_4_ = 0x40400000;
              auVar77 = vmulps_avx512vl(auVar75,auVar32);
              _local_4c0 = auVar78;
              auVar75 = vsubps_avx(auVar74,auVar78);
              local_6c0._0_16_ = auVar75;
              auVar75 = vdpps_avx(auVar75,auVar75,0x7f);
              local_660._0_16_ = auVar75;
              local_760._0_16_ = auVar221._0_16_;
              local_780._4_4_ = uVar149;
              local_780._0_4_ = fVar167;
              local_780._8_4_ = uVar248;
              local_780._16_16_ = auVar84._16_16_;
              local_780._12_4_ = uVar249;
              if (auVar75._0_4_ < 0.0) {
                auVar254._0_4_ = sqrtf(auVar75._0_4_);
                auVar254._4_60_ = extraout_var_01;
                auVar75 = auVar254._0_16_;
              }
              else {
                auVar75 = vsqrtss_avx(auVar75,auVar75);
              }
              local_500._0_16_ = vdpps_avx(auVar77,auVar77,0x7f);
              fVar147 = local_500._0_4_;
              auVar194._4_12_ = ZEXT812(0) << 0x20;
              auVar194._0_4_ = fVar147;
              local_6e0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar194);
              fVar166 = local_6e0._0_4_;
              local_520._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar194);
              auVar33._8_4_ = 0x80000000;
              auVar33._0_8_ = 0x8000000080000000;
              auVar33._12_4_ = 0x80000000;
              auVar78 = vxorps_avx512vl(local_500._0_16_,auVar33);
              auVar74 = vfnmadd213ss_fma(local_520._0_16_,local_500._0_16_,ZEXT416(0x40000000));
              local_540._0_4_ = auVar74._0_4_;
              local_680._0_4_ = auVar75._0_4_;
              if (fVar147 < auVar78._0_4_) {
                auVar255._0_4_ = sqrtf(fVar147);
                auVar255._4_60_ = extraout_var_02;
                auVar75 = ZEXT416((uint)local_680._0_4_);
                auVar74 = auVar255._0_16_;
              }
              else {
                auVar74 = vsqrtss_avx512f(local_500._0_16_,local_500._0_16_);
              }
              fVar168 = local_6e0._0_4_;
              fVar147 = fVar166 * 1.5 + fVar147 * -0.5 * fVar168 * fVar168 * fVar168;
              auVar252._0_4_ = auVar77._0_4_ * fVar147;
              auVar252._4_4_ = auVar77._4_4_ * fVar147;
              auVar252._8_4_ = auVar77._8_4_ * fVar147;
              auVar252._12_4_ = auVar77._12_4_ * fVar147;
              local_6e0._0_16_ = vdpps_avx(local_6c0._0_16_,auVar252,0x7f);
              auVar79 = vaddss_avx512f(auVar75,ZEXT416(0x3f800000));
              auVar138._0_4_ = local_6e0._0_4_ * local_6e0._0_4_;
              auVar138._4_4_ = local_6e0._4_4_ * local_6e0._4_4_;
              auVar138._8_4_ = local_6e0._8_4_ * local_6e0._8_4_;
              auVar138._12_4_ = local_6e0._12_4_ * local_6e0._12_4_;
              auVar78 = vsubps_avx(local_660._0_16_,auVar138);
              fVar166 = auVar78._0_4_;
              auVar158._4_12_ = ZEXT812(0) << 0x20;
              auVar158._0_4_ = fVar166;
              auVar80 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar158);
              auVar81 = vmulss_avx512f(auVar80,ZEXT416(0x3fc00000));
              auVar76 = vmulss_avx512f(auVar78,ZEXT416(0xbf000000));
              uVar66 = fVar166 == 0.0;
              uVar64 = fVar166 < 0.0;
              if ((bool)uVar64) {
                local_620 = fVar147;
                fStack_61c = fVar147;
                fStack_618 = fVar147;
                fStack_614 = fVar147;
                local_610 = auVar252;
                local_600 = auVar80;
                fVar171 = sqrtf(fVar166);
                auVar76 = ZEXT416(auVar76._0_4_);
                auVar81 = ZEXT416(auVar81._0_4_);
                auVar74 = ZEXT416(auVar74._0_4_);
                auVar75 = ZEXT416((uint)local_680._0_4_);
                auVar79 = ZEXT416(auVar79._0_4_);
                auVar252 = local_610;
                auVar80 = local_600;
                fVar147 = local_620;
                fVar166 = fStack_61c;
                fVar168 = fStack_618;
                fVar170 = fStack_614;
              }
              else {
                auVar78 = vsqrtss_avx(auVar78,auVar78);
                fVar171 = auVar78._0_4_;
                fVar166 = fVar147;
                fVar168 = fVar147;
                fVar170 = fVar147;
              }
              auVar266 = ZEXT3264(local_700);
              auVar246 = ZEXT3264(local_820);
              auVar251 = ZEXT3264(local_840);
              auVar265 = ZEXT3264(local_880);
              auVar254 = ZEXT3264(local_8a0);
              auVar255 = ZEXT3264(local_8c0);
              auVar256 = ZEXT3264(local_8e0);
              auVar257 = ZEXT3264(local_900);
              auVar258 = ZEXT3264(local_7a0);
              auVar259 = ZEXT3264(local_920);
              auVar260 = ZEXT3264(local_7c0);
              auVar261 = ZEXT3264(local_940);
              auVar262 = ZEXT3264(local_960);
              auVar263 = ZEXT3264(local_7e0);
              auVar78 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_760._0_16_,
                                        local_4e0._0_16_);
              fVar146 = auVar78._0_4_ * 6.0;
              fVar172 = local_760._0_4_ * 6.0;
              auVar195._0_4_ = fVar172 * (float)local_5c0._0_4_;
              auVar195._4_4_ = fVar172 * (float)local_5c0._4_4_;
              auVar195._8_4_ = fVar172 * fStack_5b8;
              auVar195._12_4_ = fVar172 * fStack_5b4;
              auVar159._4_4_ = fVar146;
              auVar159._0_4_ = fVar146;
              auVar159._8_4_ = fVar146;
              auVar159._12_4_ = fVar146;
              auVar78 = vfmadd132ps_fma(auVar159,auVar195,local_580._0_16_);
              auVar264 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_4e0._0_16_,
                                         local_760._0_16_);
              fVar146 = auVar264._0_4_ * 6.0;
              auVar196._4_4_ = fVar146;
              auVar196._0_4_ = fVar146;
              auVar196._8_4_ = fVar146;
              auVar196._12_4_ = fVar146;
              auVar78 = vfmadd132ps_fma(auVar196,auVar78,local_5a0._0_16_);
              fVar146 = local_4e0._0_4_ * 6.0;
              auVar160._4_4_ = fVar146;
              auVar160._0_4_ = fVar146;
              auVar160._8_4_ = fVar146;
              auVar160._12_4_ = fVar146;
              auVar78 = vfmadd132ps_fma(auVar160,auVar78,local_560._0_16_);
              auVar197._0_4_ = auVar78._0_4_ * (float)local_500._0_4_;
              auVar197._4_4_ = auVar78._4_4_ * (float)local_500._0_4_;
              auVar197._8_4_ = auVar78._8_4_ * (float)local_500._0_4_;
              auVar197._12_4_ = auVar78._12_4_ * (float)local_500._0_4_;
              auVar78 = vdpps_avx(auVar77,auVar78,0x7f);
              fVar146 = auVar78._0_4_;
              auVar161._0_4_ = auVar77._0_4_ * fVar146;
              auVar161._4_4_ = auVar77._4_4_ * fVar146;
              auVar161._8_4_ = auVar77._8_4_ * fVar146;
              auVar161._12_4_ = auVar77._12_4_ * fVar146;
              auVar78 = vsubps_avx(auVar197,auVar161);
              fVar146 = (float)local_540._0_4_ * (float)local_520._0_4_;
              auVar34._8_4_ = 0x80000000;
              auVar34._0_8_ = 0x8000000080000000;
              auVar34._12_4_ = 0x80000000;
              auVar82 = vxorps_avx512vl(auVar77,auVar34);
              auVar218._0_4_ = fVar147 * auVar78._0_4_ * fVar146;
              auVar218._4_4_ = fVar166 * auVar78._4_4_ * fVar146;
              auVar218._8_4_ = fVar168 * auVar78._8_4_ * fVar146;
              auVar218._12_4_ = fVar170 * auVar78._12_4_ * fVar146;
              auVar78 = vdpps_avx(auVar82,auVar252,0x7f);
              auVar264 = vmaxss_avx(ZEXT416((uint)fVar148),
                                    ZEXT416((uint)((float)local_780._0_4_ * fVar169 * 1.9073486e-06)
                                           ));
              auVar83 = vdivss_avx512f(ZEXT416((uint)fVar148),auVar74);
              auVar74 = vdpps_avx(local_6c0._0_16_,auVar218,0x7f);
              auVar75 = vfmadd213ss_fma(auVar75,ZEXT416((uint)fVar148),auVar264);
              vfmadd213ss_avx512f(auVar79,auVar83,auVar75);
              auVar75 = vdpps_avx(local_690,auVar252,0x7f);
              fVar147 = auVar78._0_4_ + auVar74._0_4_;
              auVar74 = vdpps_avx(local_6c0._0_16_,auVar82,0x7f);
              auVar79 = vmulss_avx512f(auVar76,auVar80);
              auVar80 = vmulss_avx512f(auVar80,auVar80);
              auVar78 = vdpps_avx(local_6c0._0_16_,local_690,0x7f);
              auVar80 = vaddss_avx512f(auVar81,ZEXT416((uint)(auVar79._0_4_ * auVar80._0_4_)));
              auVar79 = vfnmadd231ss_avx512f(auVar74,local_6e0._0_16_,ZEXT416((uint)fVar147));
              auVar81 = vfnmadd231ss_avx512f(auVar78,local_6e0._0_16_,auVar75);
              auVar74 = vpermilps_avx(_local_4c0,0xff);
              fVar171 = fVar171 - auVar74._0_4_;
              auVar74 = vshufps_avx(auVar77,auVar77,0xff);
              auVar78 = vfmsub213ss_fma(auVar79,auVar80,auVar74);
              fVar166 = auVar81._0_4_ * auVar80._0_4_;
              auVar80 = vfmsub231ss_fma(ZEXT416((uint)(auVar75._0_4_ * auVar78._0_4_)),
                                        ZEXT416((uint)fVar147),ZEXT416((uint)fVar166));
              fVar168 = auVar80._0_4_;
              auVar239._0_4_ = fVar166 / fVar168;
              auVar239._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar230._0_4_ = auVar78._0_4_ / fVar168;
              auVar230._4_12_ = auVar78._4_12_;
              auVar78 = vmulss_avx512f(local_6e0._0_16_,auVar239);
              auVar80 = vmulss_avx512f(local_6e0._0_16_,auVar230);
              fVar173 = local_760._0_4_ - (auVar78._0_4_ - fVar171 * (auVar75._0_4_ / fVar168));
              auVar221 = ZEXT464((uint)fVar173);
              fVar167 = (float)local_780._0_4_ - (fVar171 * (fVar147 / fVar168) - auVar80._0_4_);
              uVar149 = 0;
              uVar248 = 0;
              uVar249 = 0;
              auVar35._8_4_ = 0x7fffffff;
              auVar35._0_8_ = 0x7fffffff7fffffff;
              auVar35._12_4_ = 0x7fffffff;
              auVar75 = vandps_avx512vl(local_6e0._0_16_,auVar35);
              auVar75 = vucomiss_avx512f(auVar75);
              fVar147 = (float)local_980._0_4_;
              fVar166 = (float)local_980._4_4_;
              fVar168 = fStack_978;
              fVar170 = fStack_974;
              fVar146 = fStack_970;
              fVar172 = fStack_96c;
              fVar174 = fStack_968;
              fVar176 = fStack_964;
              if (!(bool)uVar64 && !(bool)uVar66) {
                auVar75 = vaddss_avx512f(auVar264,auVar75);
                auVar75 = vfmadd231ss_fma(auVar75,local_630,ZEXT416(0x36000000));
                auVar36._8_4_ = 0x7fffffff;
                auVar36._0_8_ = 0x7fffffff7fffffff;
                auVar36._12_4_ = 0x7fffffff;
                auVar78 = vandps_avx512vl(ZEXT416((uint)fVar171),auVar36);
                if (auVar78._0_4_ < auVar75._0_4_) {
                  fVar167 = fVar167 + (float)local_640._0_4_;
                  auVar241 = ZEXT3264(local_860);
                  if (fVar167 < fVar128) {
LAB_01b6b690:
                    bVar58 = 0;
                    goto LAB_01b6b696;
                  }
                  fVar169 = *(float *)(ray + k * 4 + 0x80);
                  auVar221 = ZEXT3264(_local_800);
                  if (fVar167 <= fVar169) {
                    bVar58 = 0;
                    if ((fVar173 < 0.0) || (1.0 < fVar173)) goto LAB_01b6b69f;
                    auVar52._12_4_ = 0;
                    auVar52._0_12_ = ZEXT812(0);
                    auVar75 = vrsqrt14ss_avx512f(auVar52 << 0x20,ZEXT416((uint)local_660._0_4_));
                    fVar171 = auVar75._0_4_;
                    pGVar3 = (context->scene->geometries).items[local_738].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) goto LAB_01b6b690;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar58 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_01b6b696;
                    fVar171 = fVar171 * 1.5 +
                              (float)local_660._0_4_ * -0.5 * fVar171 * fVar171 * fVar171;
                    auVar198._0_4_ = local_6c0._0_4_ * fVar171;
                    auVar198._4_4_ = local_6c0._4_4_ * fVar171;
                    auVar198._8_4_ = local_6c0._8_4_ * fVar171;
                    auVar198._12_4_ = local_6c0._12_4_ * fVar171;
                    auVar78 = vfmadd213ps_fma(auVar74,auVar198,auVar77);
                    auVar75 = vshufps_avx(auVar198,auVar198,0xc9);
                    auVar74 = vshufps_avx(auVar77,auVar77,0xc9);
                    auVar199._0_4_ = auVar198._0_4_ * auVar74._0_4_;
                    auVar199._4_4_ = auVar198._4_4_ * auVar74._4_4_;
                    auVar199._8_4_ = auVar198._8_4_ * auVar74._8_4_;
                    auVar199._12_4_ = auVar198._12_4_ * auVar74._12_4_;
                    auVar77 = vfmsub231ps_fma(auVar199,auVar77,auVar75);
                    auVar75 = vshufps_avx(auVar77,auVar77,0xc9);
                    auVar74 = vshufps_avx(auVar78,auVar78,0xc9);
                    auVar77 = vshufps_avx(auVar77,auVar77,0xd2);
                    auVar139._0_4_ = auVar78._0_4_ * auVar77._0_4_;
                    auVar139._4_4_ = auVar78._4_4_ * auVar77._4_4_;
                    auVar139._8_4_ = auVar78._8_4_ * auVar77._8_4_;
                    auVar139._12_4_ = auVar78._12_4_ * auVar77._12_4_;
                    auVar75 = vfmsub231ps_fma(auVar139,auVar75,auVar74);
                    local_460 = (RTCHitN  [16])vshufps_avx(auVar75,auVar75,0x55);
                    auStack_450 = vshufps_avx(auVar75,auVar75,0xaa);
                    local_440 = auVar75._0_4_;
                    uStack_43c = local_440;
                    uStack_438 = local_440;
                    uStack_434 = local_440;
                    local_430 = fVar173;
                    fStack_42c = fVar173;
                    fStack_428 = fVar173;
                    fStack_424 = fVar173;
                    local_420 = ZEXT416(0) << 0x20;
                    local_410 = local_470._0_8_;
                    uStack_408 = local_470._8_8_;
                    local_400 = local_480;
                    vpcmpeqd_avx2(ZEXT1632(local_480),ZEXT1632(local_480));
                    uStack_3ec = context->user->instID[0];
                    local_3f0 = uStack_3ec;
                    uStack_3e8 = uStack_3ec;
                    uStack_3e4 = uStack_3ec;
                    uStack_3e0 = context->user->instPrimID[0];
                    uStack_3dc = uStack_3e0;
                    uStack_3d8 = uStack_3e0;
                    uStack_3d4 = uStack_3e0;
                    *(float *)(ray + k * 4 + 0x80) = fVar167;
                    local_9a0 = local_490;
                    local_730.valid = (int *)local_9a0;
                    local_730.geometryUserPtr = pGVar3->userPtr;
                    local_730.context = context->user;
                    local_730.hit = local_460;
                    local_730.N = 4;
                    local_730.ray = (RTCRayN *)ray;
                    if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar3->occlusionFilterN)(&local_730);
                      auVar263 = ZEXT3264(local_7e0);
                      auVar262 = ZEXT3264(local_960);
                      auVar261 = ZEXT3264(local_940);
                      auVar260 = ZEXT3264(local_7c0);
                      auVar259 = ZEXT3264(local_920);
                      auVar258 = ZEXT3264(local_7a0);
                      auVar257 = ZEXT3264(local_900);
                      auVar256 = ZEXT3264(local_8e0);
                      auVar255 = ZEXT3264(local_8c0);
                      auVar254 = ZEXT3264(local_8a0);
                      auVar241 = ZEXT3264(local_860);
                      auVar265 = ZEXT3264(local_880);
                      auVar251 = ZEXT3264(local_840);
                      auVar246 = ZEXT3264(local_820);
                      auVar266 = ZEXT3264(local_700);
                      fVar147 = (float)local_980._0_4_;
                      fVar166 = (float)local_980._4_4_;
                      fVar168 = fStack_978;
                      fVar170 = fStack_974;
                      fVar146 = fStack_970;
                      fVar172 = fStack_96c;
                      fVar174 = fStack_968;
                      fVar176 = fStack_964;
                    }
                    uVar67 = vptestmd_avx512vl(local_9a0,local_9a0);
                    if ((uVar67 & 0xf) == 0) {
                      auVar221 = ZEXT3264(_local_800);
                    }
                    else {
                      p_Var7 = context->args->filter;
                      if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var7)(&local_730);
                        auVar263 = ZEXT3264(local_7e0);
                        auVar262 = ZEXT3264(local_960);
                        auVar261 = ZEXT3264(local_940);
                        auVar260 = ZEXT3264(local_7c0);
                        auVar259 = ZEXT3264(local_920);
                        auVar258 = ZEXT3264(local_7a0);
                        auVar257 = ZEXT3264(local_900);
                        auVar256 = ZEXT3264(local_8e0);
                        auVar255 = ZEXT3264(local_8c0);
                        auVar254 = ZEXT3264(local_8a0);
                        auVar241 = ZEXT3264(local_860);
                        auVar265 = ZEXT3264(local_880);
                        auVar251 = ZEXT3264(local_840);
                        auVar246 = ZEXT3264(local_820);
                        auVar266 = ZEXT3264(local_700);
                        fVar147 = (float)local_980._0_4_;
                        fVar166 = (float)local_980._4_4_;
                        fVar168 = fStack_978;
                        fVar170 = fStack_974;
                        fVar146 = fStack_970;
                        fVar172 = fStack_96c;
                        fVar174 = fStack_968;
                        fVar176 = fStack_964;
                      }
                      uVar67 = vptestmd_avx512vl(local_9a0,local_9a0);
                      uVar67 = uVar67 & 0xf;
                      auVar75 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar8 = (bool)((byte)uVar67 & 1);
                      bVar9 = (bool)((byte)(uVar67 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar67 >> 2) & 1);
                      bVar11 = SUB81(uVar67 >> 3,0);
                      *(uint *)(local_730.ray + 0x80) =
                           (uint)bVar8 * auVar75._0_4_ |
                           (uint)!bVar8 * *(int *)(local_730.ray + 0x80);
                      *(uint *)(local_730.ray + 0x84) =
                           (uint)bVar9 * auVar75._4_4_ |
                           (uint)!bVar9 * *(int *)(local_730.ray + 0x84);
                      *(uint *)(local_730.ray + 0x88) =
                           (uint)bVar10 * auVar75._8_4_ |
                           (uint)!bVar10 * *(int *)(local_730.ray + 0x88);
                      *(uint *)(local_730.ray + 0x8c) =
                           (uint)bVar11 * auVar75._12_4_ |
                           (uint)!bVar11 * *(int *)(local_730.ray + 0x8c);
                      bVar58 = 1;
                      auVar221 = ZEXT3264(_local_800);
                      if ((byte)uVar67 != 0) goto LAB_01b6b69f;
                    }
                    *(float *)(ray + k * 4 + 0x80) = fVar169;
                  }
                  bVar58 = 0;
                  goto LAB_01b6b69f;
                }
              }
              bVar65 = uVar67 < 4;
              uVar67 = uVar67 + 1;
            } while (uVar67 != 5);
            bVar65 = false;
            bVar58 = 5;
LAB_01b6b696:
            auVar241 = ZEXT3264(local_860);
            auVar221 = ZEXT3264(_local_800);
LAB_01b6b69f:
            bVar62 = (bool)(bVar62 | bVar65 & bVar58);
            uVar149 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar144._4_4_ = uVar149;
            auVar144._0_4_ = uVar149;
            auVar144._8_4_ = uVar149;
            auVar144._12_4_ = uVar149;
            auVar144._16_4_ = uVar149;
            auVar144._20_4_ = uVar149;
            auVar144._24_4_ = uVar149;
            auVar144._28_4_ = uVar149;
            auVar54._4_4_ = fStack_33c;
            auVar54._0_4_ = local_340;
            auVar54._8_4_ = fStack_338;
            auVar54._12_4_ = fStack_334;
            auVar54._16_4_ = fStack_330;
            auVar54._20_4_ = fStack_32c;
            auVar54._24_4_ = fStack_328;
            auVar54._28_4_ = fStack_324;
            uVar15 = vcmpps_avx512vl(auVar144,auVar54,0xd);
            bVar61 = ~('\x01' << ((byte)iVar19 & 0x1f)) & bVar61 & (byte)uVar15;
            auVar119 = local_360;
          } while (bVar61 != 0);
        }
        auVar221 = ZEXT3264(local_5e0);
        uVar16 = vpcmpgtd_avx512vl(auVar119,local_300);
        uVar18 = vpcmpd_avx512vl(local_300,local_280,1);
        auVar202._0_4_ = fVar147 + (float)local_1c0._0_4_;
        auVar202._4_4_ = fVar166 + (float)local_1c0._4_4_;
        auVar202._8_4_ = fVar168 + fStack_1b8;
        auVar202._12_4_ = fVar170 + fStack_1b4;
        auVar202._16_4_ = fVar146 + fStack_1b0;
        auVar202._20_4_ = fVar172 + fStack_1ac;
        auVar202._24_4_ = fVar174 + fStack_1a8;
        auVar202._28_4_ = fVar176 + fStack_1a4;
        uVar15 = vcmpps_avx512vl(auVar202,auVar144,2);
        bVar59 = bVar59 & (byte)uVar18 & (byte)uVar15;
        auVar203._0_4_ = fVar147 + local_2e0._0_4_;
        auVar203._4_4_ = fVar166 + local_2e0._4_4_;
        auVar203._8_4_ = fVar168 + local_2e0._8_4_;
        auVar203._12_4_ = fVar170 + local_2e0._12_4_;
        auVar203._16_4_ = fVar146 + local_2e0._16_4_;
        auVar203._20_4_ = fVar172 + local_2e0._20_4_;
        auVar203._24_4_ = fVar174 + local_2e0._24_4_;
        auVar203._28_4_ = fVar176 + local_2e0._28_4_;
        uVar15 = vcmpps_avx512vl(auVar203,auVar144,2);
        bVar56 = bVar56 & (byte)uVar16 & (byte)uVar15 | bVar59;
        if (bVar56 != 0) {
          uVar68 = (ulong)uVar60;
          abStack_180[uVar68 * 0x60] = bVar56;
          bVar65 = (bool)(bVar59 >> 1 & 1);
          bVar8 = (bool)(bVar59 >> 2 & 1);
          bVar9 = (bool)(bVar59 >> 3 & 1);
          bVar10 = (bool)(bVar59 >> 4 & 1);
          bVar11 = (bool)(bVar59 >> 5 & 1);
          auStack_160[uVar68 * 0x18] =
               (uint)(bVar59 & 1) * local_1c0._0_4_ |
               (uint)!(bool)(bVar59 & 1) * (int)local_2e0._0_4_;
          auStack_160[uVar68 * 0x18 + 1] =
               (uint)bVar65 * local_1c0._4_4_ | (uint)!bVar65 * (int)local_2e0._4_4_;
          auStack_160[uVar68 * 0x18 + 2] =
               (uint)bVar8 * (int)fStack_1b8 | (uint)!bVar8 * (int)local_2e0._8_4_;
          auStack_160[uVar68 * 0x18 + 3] =
               (uint)bVar9 * (int)fStack_1b4 | (uint)!bVar9 * (int)local_2e0._12_4_;
          auStack_160[uVar68 * 0x18 + 4] =
               (uint)bVar10 * (int)fStack_1b0 | (uint)!bVar10 * (int)local_2e0._16_4_;
          auStack_160[uVar68 * 0x18 + 5] =
               (uint)bVar11 * (int)fStack_1ac | (uint)!bVar11 * (int)local_2e0._20_4_;
          auStack_160[uVar68 * 0x18 + 6] =
               (uint)(bVar59 >> 6) * (int)fStack_1a8 |
               (uint)!(bool)(bVar59 >> 6) * (int)local_2e0._24_4_;
          (&fStack_144)[uVar68 * 0x18] = local_2e0._28_4_;
          uVar67 = vmovlps_avx(local_310);
          (&uStack_140)[uVar68 * 0xc] = uVar67;
          aiStack_138[uVar68 * 0x18] = local_98c + 1;
          uVar60 = uVar60 + 1;
        }
      }
    }
    do {
      uVar70 = uVar60;
      uVar69 = uVar70 - 1;
      if (uVar70 == 0) {
        if (bVar62 != false) {
          return bVar62;
        }
        uVar149 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar37._4_4_ = uVar149;
        auVar37._0_4_ = uVar149;
        auVar37._8_4_ = uVar149;
        auVar37._12_4_ = uVar149;
        uVar15 = vcmpps_avx512vl(local_320,auVar37,2);
        uVar60 = (uint)uVar15 & (uint)local_5e8 - 1 & (uint)local_5e8;
        local_5e8 = (ulong)uVar60;
        if (uVar60 == 0) {
          return false;
        }
        goto LAB_01b69382;
      }
      uVar67 = (ulong)uVar69;
      auVar84 = *(undefined1 (*) [32])(auStack_160 + uVar67 * 0x18);
      auVar162._0_4_ = fVar147 + auVar84._0_4_;
      auVar162._4_4_ = fVar166 + auVar84._4_4_;
      auVar162._8_4_ = fVar168 + auVar84._8_4_;
      auVar162._12_4_ = fVar170 + auVar84._12_4_;
      auVar162._16_4_ = fVar146 + auVar84._16_4_;
      auVar162._20_4_ = fVar172 + auVar84._20_4_;
      auVar162._24_4_ = fVar174 + auVar84._24_4_;
      auVar162._28_4_ = fVar176 + auVar84._28_4_;
      uVar149 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar40._4_4_ = uVar149;
      auVar40._0_4_ = uVar149;
      auVar40._8_4_ = uVar149;
      auVar40._12_4_ = uVar149;
      auVar40._16_4_ = uVar149;
      auVar40._20_4_ = uVar149;
      auVar40._24_4_ = uVar149;
      auVar40._28_4_ = uVar149;
      uVar15 = vcmpps_avx512vl(auVar162,auVar40,2);
      uVar121 = (uint)uVar15 & (uint)abStack_180[uVar67 * 0x60];
      uVar60 = uVar69;
    } while (uVar121 == 0);
    uVar68 = (&uStack_140)[uVar67 * 0xc];
    auVar153._8_8_ = 0;
    auVar153._0_8_ = uVar68;
    auVar201._8_4_ = 0x7f800000;
    auVar201._0_8_ = 0x7f8000007f800000;
    auVar201._12_4_ = 0x7f800000;
    auVar201._16_4_ = 0x7f800000;
    auVar201._20_4_ = 0x7f800000;
    auVar201._24_4_ = 0x7f800000;
    auVar201._28_4_ = 0x7f800000;
    auVar86 = vblendmps_avx512vl(auVar201,auVar84);
    bVar56 = (byte)uVar121;
    auVar117._0_4_ =
         (uint)(bVar56 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar56 & 1) * (int)auVar84._0_4_;
    bVar65 = (bool)((byte)(uVar121 >> 1) & 1);
    auVar117._4_4_ = (uint)bVar65 * auVar86._4_4_ | (uint)!bVar65 * (int)auVar84._4_4_;
    bVar65 = (bool)((byte)(uVar121 >> 2) & 1);
    auVar117._8_4_ = (uint)bVar65 * auVar86._8_4_ | (uint)!bVar65 * (int)auVar84._8_4_;
    bVar65 = (bool)((byte)(uVar121 >> 3) & 1);
    auVar117._12_4_ = (uint)bVar65 * auVar86._12_4_ | (uint)!bVar65 * (int)auVar84._12_4_;
    bVar65 = (bool)((byte)(uVar121 >> 4) & 1);
    auVar117._16_4_ = (uint)bVar65 * auVar86._16_4_ | (uint)!bVar65 * (int)auVar84._16_4_;
    bVar65 = (bool)((byte)(uVar121 >> 5) & 1);
    auVar117._20_4_ = (uint)bVar65 * auVar86._20_4_ | (uint)!bVar65 * (int)auVar84._20_4_;
    bVar65 = (bool)((byte)(uVar121 >> 6) & 1);
    auVar117._24_4_ = (uint)bVar65 * auVar86._24_4_ | (uint)!bVar65 * (int)auVar84._24_4_;
    auVar117._28_4_ =
         (uVar121 >> 7) * auVar86._28_4_ | (uint)!SUB41(uVar121 >> 7,0) * (int)auVar84._28_4_;
    auVar84 = vshufps_avx(auVar117,auVar117,0xb1);
    auVar84 = vminps_avx(auVar117,auVar84);
    auVar86 = vshufpd_avx(auVar84,auVar84,5);
    auVar84 = vminps_avx(auVar84,auVar86);
    auVar86 = vpermpd_avx2(auVar84,0x4e);
    auVar84 = vminps_avx(auVar84,auVar86);
    uVar15 = vcmpps_avx512vl(auVar117,auVar84,0);
    bVar59 = (byte)uVar15 & bVar56;
    if (bVar59 != 0) {
      uVar121 = (uint)bVar59;
    }
    uVar122 = 0;
    for (; (uVar121 & 1) == 0; uVar121 = uVar121 >> 1 | 0x80000000) {
      uVar122 = uVar122 + 1;
    }
    local_98c = aiStack_138[uVar67 * 0x18];
    bVar56 = ~('\x01' << ((byte)uVar122 & 0x1f)) & bVar56;
    abStack_180[uVar67 * 0x60] = bVar56;
    uVar60 = uVar70;
    if (bVar56 == 0) {
      uVar60 = uVar69;
    }
    uVar149 = (undefined4)uVar68;
    auVar141._4_4_ = uVar149;
    auVar141._0_4_ = uVar149;
    auVar141._8_4_ = uVar149;
    auVar141._12_4_ = uVar149;
    auVar141._16_4_ = uVar149;
    auVar141._20_4_ = uVar149;
    auVar141._24_4_ = uVar149;
    auVar141._28_4_ = uVar149;
    auVar75 = vmovshdup_avx(auVar153);
    auVar75 = vsubps_avx(auVar75,auVar153);
    auVar163._0_4_ = auVar75._0_4_;
    auVar163._4_4_ = auVar163._0_4_;
    auVar163._8_4_ = auVar163._0_4_;
    auVar163._12_4_ = auVar163._0_4_;
    auVar163._16_4_ = auVar163._0_4_;
    auVar163._20_4_ = auVar163._0_4_;
    auVar163._24_4_ = auVar163._0_4_;
    auVar163._28_4_ = auVar163._0_4_;
    auVar75 = vfmadd132ps_fma(auVar163,auVar141,_DAT_01faff20);
    _local_460 = ZEXT1632(auVar75);
    local_310._8_8_ = 0;
    local_310._0_8_ = *(ulong *)(local_460 + (ulong)uVar122 * 4);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }